

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void compact_upto_test(bool multi_kv)

{
  uint64_t *puVar1;
  short *psVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_kvs_handle *handle;
  fdb_kvs_handle *doc;
  fdb_kvs_handle *pfVar8;
  fdb_kvs_config *config;
  fdb_kvs_info *info;
  fdb_file_info *kvs_config_00;
  void *__s2;
  code *__s;
  void *pvVar9;
  fdb_kvs_handle **ppfVar10;
  fdb_kvs_handle *pfVar11;
  char *pcVar12;
  fdb_kvs_handle *pfVar13;
  fdb_file_info *info_00;
  undefined7 in_register_00000039;
  fdb_kvs_handle *ptr_fhandle;
  undefined1 handle_00 [8];
  uint uVar14;
  bool *pbVar15;
  ulong uVar16;
  char *pcVar17;
  btree *config_00;
  fdb_config *pfVar18;
  ulong uVar19;
  long lVar20;
  btree *ptr_fhandle_00;
  fdb_doc **doc_00;
  __atomic_base<unsigned_long> _Var21;
  timeval tVar22;
  timeval tVar23;
  fdb_snapshot_info_t *markers;
  fdb_file_handle *dbfile;
  uint64_t num_markers;
  char kv_name [8];
  fdb_kvs_handle *snapshot;
  fdb_kvs_config kvs_config;
  char compact_filename [32];
  timeval __test_begin;
  char metabuf [256];
  char keybuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_16270;
  undefined1 auStack_16268 [16];
  undefined1 auStack_16258 [8];
  undefined1 auStack_16250 [80];
  ulong uStack_16200;
  timeval tStack_161e0;
  fdb_file_info afStack_161d0 [3];
  fdb_file_info afStack_160d0 [3];
  fdb_config fStack_15fd0;
  fdb_kvs_handle *pfStack_15ed8;
  fdb_kvs_handle *pfStack_15ed0;
  fdb_kvs_handle *pfStack_15ec8;
  fdb_config *pfStack_15ec0;
  fdb_doc **ppfStack_15eb8;
  fdb_kvs_handle *pfStack_15eb0;
  fdb_file_handle *pfStack_15ea0;
  fdb_kvs_handle *pfStack_15e98;
  timeval atStack_15e90 [2];
  timeval tStack_15e70;
  timeval tStack_15e60;
  undefined1 auStack_15e50 [70];
  undefined1 uStack_15e0a;
  undefined8 uStack_15e00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_15d40;
  fdb_kvs_handle *pfStack_15d38;
  fdb_kvs_handle *pfStack_15d30;
  fdb_kvs_handle *pfStack_15d28;
  fdb_doc **ppfStack_15d20;
  fdb_kvs_handle *pfStack_15d18;
  undefined1 auStack_15d00 [16];
  fdb_kvs_handle *pfStack_15cf0;
  fdb_kvs_handle *pfStack_15ce8;
  fdb_kvs_handle *pfStack_15ce0;
  fdb_kvs_handle *pfStack_15cd8;
  fdb_kvs_handle *pfStack_15cd0;
  fdb_kvs_config fStack_15cc8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_15cb0;
  filemgr *pfStack_15ca8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_15ca0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_15c98;
  filemgr *pfStack_15c90;
  fdb_kvs_handle *pfStack_15c88;
  timeval tStack_15c80;
  undefined1 auStack_15c70 [256];
  __atomic_base<unsigned_long> _Stack_15b70;
  timeval tStack_15b68;
  __atomic_base<unsigned_long> _Stack_15b58;
  fdb_doc *apfStack_15b10 [32];
  char acStack_15a10 [256];
  char acStack_15910 [256];
  fdb_kvs_handle afStack_15810 [153];
  char acStack_1f90 [8];
  fdb_kvs_handle *pfStack_1f88;
  fdb_kvs_handle *pfStack_1f80;
  fdb_kvs_handle *pfStack_1f78;
  fdb_kvs_handle *pfStack_1f70;
  fdb_doc **ppfStack_1f68;
  fdb_kvs_handle *pfStack_1f60;
  fdb_kvs_handle *pfStack_1f48;
  fdb_kvs_handle *pfStack_1f40;
  fdb_doc *pfStack_1f38;
  void *pvStack_1f30;
  fdb_kvs_config fStack_1f28;
  undefined1 auStack_1f10 [48];
  timeval tStack_1ee0;
  undefined1 auStack_1ed0 [760];
  char acStack_1bd8 [256];
  fdb_doc *apfStack_1ad8 [101];
  fdb_kvs_handle **ppfStack_17b0;
  fdb_kvs_handle *pfStack_17a8;
  fdb_kvs_handle *pfStack_17a0;
  fdb_kvs_info *pfStack_1798;
  fdb_doc **ppfStack_1790;
  fdb_kvs_handle *pfStack_1788;
  undefined1 auStack_1770 [16];
  undefined1 auStack_1760 [24];
  undefined1 auStack_1748 [32];
  fdb_kvs_handle *apfStack_1728 [5];
  timeval tStack_1700;
  char acStack_16f0 [256];
  fdb_doc *apfStack_15f0 [31];
  fdb_config fStack_14f8;
  undefined1 auStack_1400 [752];
  undefined8 auStack_1110 [31];
  fdb_kvs_handle **ppfStack_1018;
  fdb_kvs_handle *pfStack_1010;
  fdb_kvs_handle *pfStack_1008;
  fdb_kvs_config *pfStack_1000;
  fdb_doc **ppfStack_ff8;
  fdb_kvs_handle *pfStack_ff0;
  fdb_kvs_handle *pfStack_fd8;
  fdb_kvs_handle *pfStack_fd0;
  fdb_doc *pfStack_fc8;
  fdb_kvs_handle *pfStack_fc0;
  fdb_doc *apfStack_fb8 [11];
  timeval tStack_f60;
  fdb_kvs_config fStack_f50;
  char acStack_f38 [256];
  undefined1 auStack_e38 [656];
  fdb_config fStack_ba8;
  fdb_kvs_handle **ppfStack_ab0;
  fdb_kvs_handle *pfStack_aa8;
  fdb_kvs_handle *pfStack_aa0;
  btree *pbStack_a98;
  btree *pbStack_a90;
  fdb_kvs_handle *pfStack_a88;
  fdb_kvs_handle *pfStack_a78;
  fdb_kvs_handle *pfStack_a70;
  fdb_file_handle *pfStack_a68;
  fdb_kvs_handle *pfStack_a60;
  undefined1 auStack_a58 [40];
  undefined1 auStack_a30 [40];
  fdb_file_info fStack_a08;
  undefined1 auStack_9c0 [768];
  char acStack_6c0 [264];
  code *pcStack_5b8;
  fdb_kvs_handle *pfStack_5b0;
  fdb_kvs_handle *pfStack_5a8;
  char *pcStack_5a0;
  long lStack_598;
  fdb_kvs_handle *pfStack_590;
  fdb_snapshot_info_t *local_578;
  fdb_file_handle *local_570;
  char *local_568;
  int local_55c;
  undefined1 local_558 [96];
  undefined1 local_4f8 [32];
  timeval local_4d8;
  fdb_kvs_handle local_4c8;
  char local_228 [256];
  fdb_config local_128;
  
  pfStack_590 = (fdb_kvs_handle *)0x10e327;
  gettimeofday(&local_4d8,(__timezone_ptr_t)0x0);
  pfStack_590 = (fdb_kvs_handle *)0x10e32c;
  memleak_start();
  pfStack_590 = (fdb_kvs_handle *)0x10e33c;
  fdb_get_default_config();
  pfStack_590 = (fdb_kvs_handle *)0x10e346;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  local_128.block_reusing_threshold = 0;
  pfStack_590 = (fdb_kvs_handle *)0x10e374;
  local_128.multi_kv_instances = multi_kv;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_590 = (fdb_kvs_handle *)0x10e388;
  fdb_open(&local_570,"./compact_test1",&local_128);
  local_55c = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_55c == 0) {
    pfStack_590 = (fdb_kvs_handle *)0x10e3f4;
    fdb_kvs_open_default
              (local_570,(fdb_kvs_handle **)(local_558 + 0x20),(fdb_kvs_config *)(local_558 + 0x48))
    ;
    uVar14 = 1;
  }
  else {
    ppfVar10 = (fdb_kvs_handle **)(local_558 + 0x20);
    uVar16 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x10e3b9;
      sprintf(local_558,"kv%d",uVar16 & 0xffffffff);
      pfStack_590 = (fdb_kvs_handle *)0x10e3cc;
      fdb_kvs_open(local_570,ppfVar10,local_558,(fdb_kvs_config *)(local_558 + 0x48));
      uVar16 = uVar16 + 1;
      ppfVar10 = ppfVar10 + 1;
    } while (uVar16 != 4);
    uVar14 = 4;
  }
  pfVar8 = (fdb_kvs_handle *)(ulong)uVar14;
  uVar16 = 0;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x10e41a;
    sprintf((char *)&local_4c8.kv_info_offset,"key%d",uVar16 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e433;
    sprintf((char *)&local_4c8.config.compaction_minimum_filesize,"meta%d",uVar16 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e44c;
    sprintf(local_228,"body%d",uVar16 & 0xffffffff);
    pbVar15 = &local_4c8.kvs_config.create_if_missing + uVar16 * 8;
    pfStack_590 = (fdb_kvs_handle *)0x10e45f;
    sVar5 = strlen((char *)&local_4c8.kv_info_offset);
    puVar1 = &local_4c8.config.compaction_minimum_filesize;
    pfStack_590 = (fdb_kvs_handle *)0x10e472;
    sVar6 = strlen((char *)puVar1);
    pfStack_590 = (fdb_kvs_handle *)0x10e482;
    sVar7 = strlen(local_228);
    pfStack_590 = (fdb_kvs_handle *)0x10e4a7;
    fdb_doc_create((fdb_doc **)pbVar15,&local_4c8.kv_info_offset,sVar5,puVar1,sVar6,local_228,sVar7)
    ;
    lVar20 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x10e4b8;
      fdb_set(*(fdb_kvs_handle **)(local_558 + lVar20 * 8 + 0x20),*(fdb_doc **)pbVar15);
      lVar20 = lVar20 + 1;
    } while (pfVar8 != (fdb_kvs_handle *)lVar20);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 5);
  pfStack_590 = (fdb_kvs_handle *)0x10e4dc;
  fdb_commit(local_570,'\x01');
  uVar16 = 5;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x10e4fe;
    sprintf((char *)&local_4c8.kv_info_offset,"key%d",uVar16 & 0xffffffff);
    puVar1 = &local_4c8.config.compaction_minimum_filesize;
    pfStack_590 = (fdb_kvs_handle *)0x10e51a;
    sprintf((char *)puVar1,"meta%d",uVar16 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e536;
    sprintf(local_228,"body%d",uVar16 & 0xffffffff);
    pbVar15 = &local_4c8.kvs_config.create_if_missing + uVar16 * 8;
    pfStack_590 = (fdb_kvs_handle *)0x10e549;
    sVar5 = strlen((char *)&local_4c8.kv_info_offset);
    pfStack_590 = (fdb_kvs_handle *)0x10e554;
    sVar6 = strlen((char *)puVar1);
    pfStack_590 = (fdb_kvs_handle *)0x10e55f;
    sVar7 = strlen(local_228);
    pfStack_590 = (fdb_kvs_handle *)0x10e584;
    fdb_doc_create((fdb_doc **)pbVar15,&local_4c8.kv_info_offset,sVar5,
                   &local_4c8.config.compaction_minimum_filesize,sVar6,local_228,sVar7);
    lVar20 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x10e594;
      fdb_set(*(fdb_kvs_handle **)(local_558 + lVar20 * 8 + 0x20),*(fdb_doc **)pbVar15);
      lVar20 = lVar20 + 1;
    } while (pfVar8 != (fdb_kvs_handle *)lVar20);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 10);
  pfStack_590 = (fdb_kvs_handle *)0x10e5b5;
  fdb_commit(local_570,'\0');
  uVar16 = 10;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x10e5d7;
    sprintf((char *)&local_4c8.kv_info_offset,"key%d",uVar16 & 0xffffffff);
    puVar1 = &local_4c8.config.compaction_minimum_filesize;
    pfStack_590 = (fdb_kvs_handle *)0x10e5f3;
    sprintf((char *)puVar1,"meta%d",uVar16 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e60f;
    sprintf(local_228,"body%d",uVar16 & 0xffffffff);
    pbVar15 = &local_4c8.kvs_config.create_if_missing + uVar16 * 8;
    pfStack_590 = (fdb_kvs_handle *)0x10e622;
    sVar5 = strlen((char *)&local_4c8.kv_info_offset);
    pfStack_590 = (fdb_kvs_handle *)0x10e62d;
    sVar6 = strlen((char *)puVar1);
    pfStack_590 = (fdb_kvs_handle *)0x10e638;
    sVar7 = strlen(local_228);
    pfStack_590 = (fdb_kvs_handle *)0x10e65d;
    fdb_doc_create((fdb_doc **)pbVar15,&local_4c8.kv_info_offset,sVar5,
                   &local_4c8.config.compaction_minimum_filesize,sVar6,local_228,sVar7);
    lVar20 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x10e66d;
      fdb_set(*(fdb_kvs_handle **)(local_558 + lVar20 * 8 + 0x20),*(fdb_doc **)pbVar15);
      lVar20 = lVar20 + 1;
    } while (pfVar8 != (fdb_kvs_handle *)lVar20);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0xf);
  pfStack_590 = (fdb_kvs_handle *)0x10e691;
  fdb_commit(local_570,'\x01');
  uVar16 = 0xf;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x10e6b3;
    sprintf((char *)&local_4c8.kv_info_offset,"key%d",uVar16 & 0xffffffff);
    puVar1 = &local_4c8.config.compaction_minimum_filesize;
    pfStack_590 = (fdb_kvs_handle *)0x10e6cf;
    sprintf((char *)puVar1,"meta%d",uVar16 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x10e6eb;
    sprintf(local_228,"body%d",uVar16 & 0xffffffff);
    doc = (fdb_kvs_handle *)(&local_4c8.kvs_config.create_if_missing + uVar16 * 8);
    pfStack_590 = (fdb_kvs_handle *)0x10e6fe;
    sVar5 = strlen((char *)&local_4c8.kv_info_offset);
    pfStack_590 = (fdb_kvs_handle *)0x10e709;
    handle = (fdb_kvs_handle *)strlen((char *)puVar1);
    pfStack_590 = (fdb_kvs_handle *)0x10e714;
    sVar6 = strlen(local_228);
    pfStack_590 = (fdb_kvs_handle *)0x10e739;
    fdb_doc_create((fdb_doc **)doc,&local_4c8.kv_info_offset,sVar5,
                   &local_4c8.config.compaction_minimum_filesize,(size_t)handle,local_228,sVar6);
    lVar20 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x10e749;
      fdb_set(*(fdb_kvs_handle **)(local_558 + lVar20 * 8 + 0x20),*(fdb_doc **)&doc->kvs_config);
      lVar20 = lVar20 + 1;
    } while (pfVar8 != (fdb_kvs_handle *)lVar20);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x14);
  lVar20 = 0;
  pfStack_590 = (fdb_kvs_handle *)0x10e76d;
  fdb_commit(local_570,'\0');
  __s = logCallbackFunc;
  pcVar17 = "compact_upto_test";
  do {
    pfStack_590 = (fdb_kvs_handle *)0x10e78b;
    fVar3 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(local_558 + lVar20 * 8 + 0x20),logCallbackFunc,
                       "compact_upto_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eacf;
    lVar20 = lVar20 + 1;
  } while (pfVar8 != (fdb_kvs_handle *)lVar20);
  pfStack_590 = (fdb_kvs_handle *)0x10e7af;
  fVar3 = fdb_get_all_snap_markers(local_570,&local_578,(uint64_t *)&local_568);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010ead4;
  if ((char)local_55c == '\0') {
    if (local_568 != (char *)0x4) {
      pfStack_590 = (fdb_kvs_handle *)0x10e8c9;
      compact_upto_test();
    }
    if (local_568 != (char *)0x0) {
      lVar20 = 0x1400000000;
      handle = (fdb_kvs_handle *)0x0;
      doc = (fdb_kvs_handle *)0xfffffffb00000000;
      pcVar17 = (char *)0x0;
      do {
        if (*(long *)((long)&local_578->num_kvs_markers + (long)handle) != 1) {
          pfStack_590 = (fdb_kvs_handle *)0x10eab6;
          compact_upto_test();
        }
        if (*(long *)(*(long *)((long)&local_578->kvs_markers + (long)handle) + 8) != lVar20 >> 0x20
           ) {
          pfStack_590 = (fdb_kvs_handle *)0x10eac3;
          compact_upto_test();
        }
        pcVar17 = pcVar17 + 1;
        lVar20 = lVar20 + -0x500000000;
        handle = (fdb_kvs_handle *)((long)handle + 0x18);
      } while (pcVar17 < local_568);
    }
    __s = (code *)local_4f8;
    pfStack_590 = (fdb_kvs_handle *)0x10e8f3;
    sprintf((char *)__s,"compact_test_compact%d",1);
    pfStack_590 = (fdb_kvs_handle *)0x10e909;
    fVar3 = fdb_compact_upto(local_570,(char *)__s,local_578[1].marker);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_590 = (fdb_kvs_handle *)0x10e92d;
      fVar3 = fdb_snapshot_open((fdb_kvs_handle *)local_558._32_8_,
                                (fdb_kvs_handle **)(local_558 + 0x18),
                                (local_578[1].kvs_markers)->seqnum);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_590 = (fdb_kvs_handle *)0x10e936;
        compact_upto_test();
        goto LAB_0010e936;
      }
LAB_0010e996:
      __s = (code *)local_4f8;
      pfStack_590 = (fdb_kvs_handle *)0x10e9a0;
      fdb_kvs_close((fdb_kvs_handle *)local_558._24_8_);
      pfStack_590 = (fdb_kvs_handle *)0x10e9af;
      fVar3 = fdb_free_snap_markers(local_578,(uint64_t)local_568);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pfStack_590 = (fdb_kvs_handle *)0x10e9c1;
        fdb_close(local_570);
        lVar20 = 0;
        do {
          pfStack_590 = (fdb_kvs_handle *)0x10e9d0;
          fdb_doc_free(*(fdb_doc **)(&local_4c8.kvs_config.create_if_missing + lVar20 * 8));
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x14);
        pfStack_590 = (fdb_kvs_handle *)0x10e9de;
        fdb_shutdown();
        pfStack_590 = (fdb_kvs_handle *)0x10e9e3;
        memleak_end();
        pcVar17 = "single kv mode:";
        if ((char)local_55c != '\0') {
          pcVar17 = "multiple kv mode:";
        }
        pfStack_590 = (fdb_kvs_handle *)0x10ea13;
        sprintf(local_228,"compact upto marker in file test %s",pcVar17);
        pcVar17 = "%s PASSED\n";
        if (compact_upto_test(bool)::__test_pass != '\0') {
          pcVar17 = "%s FAILED\n";
        }
        pfStack_590 = (fdb_kvs_handle *)0x10ea40;
        fprintf(_stderr,pcVar17,local_228);
        return;
      }
      goto LAB_0010ead9;
    }
    goto LAB_0010eade;
  }
  if (local_568 != (char *)0x8) {
    pfStack_590 = (fdb_kvs_handle *)0x10e7d7;
    compact_upto_test();
  }
  local_558._8_8_ = ZEXT48(uVar14 + 1);
  handle = (fdb_kvs_handle *)local_558;
  pvVar9 = (void *)0x0;
  do {
    pcVar17 = (char *)((long)pvVar9 * 3);
    if ((fdb_custom_cmp_variable)local_578[(long)pvVar9].num_kvs_markers !=
        (fdb_custom_cmp_variable)local_558._8_8_) {
      pfStack_590 = (fdb_kvs_handle *)0x10e8b4;
      compact_upto_test();
    }
    __s = (code *)((long)pvVar9 * -5 + 0x14);
    lVar20 = 8;
    doc = (fdb_kvs_handle *)0x0;
    local_558._16_8_ = pvVar9;
    do {
      if (*(code **)(lVar20 + (long)&(local_578[(long)pvVar9].kvs_markers)->kv_store_name) != __s) {
        pfStack_590 = (fdb_kvs_handle *)0x10e88a;
        compact_upto_test();
      }
      pfStack_590 = (fdb_kvs_handle *)0x10e83d;
      sprintf((char *)handle,"kv%d",(ulong)doc & 0xffffffff);
      psVar2 = *(short **)((long)&local_578[(long)pvVar9].kvs_markers[-1].seqnum + lVar20);
      if ((char)psVar2[1] != local_558[2] || *psVar2 != local_558._0_2_) {
        pfStack_590 = (fdb_kvs_handle *)0x10eacf;
        compact_upto_test();
        goto LAB_0010eacf;
      }
      doc = (fdb_kvs_handle *)&(doc->kvs_config).field_0x1;
      lVar20 = lVar20 + 0x10;
    } while (pfVar8 != doc);
    pvVar9 = (void *)(local_558._16_8_ + 1);
  } while ((fdb_kvs_handle *)pvVar9 != pfVar8);
LAB_0010e936:
  __s = (code *)local_4f8;
  pfStack_590 = (fdb_kvs_handle *)0x10e954;
  sprintf((char *)__s,"compact_test_compact%d",1);
  pfStack_590 = (fdb_kvs_handle *)0x10e96a;
  fVar3 = fdb_compact_upto(local_570,(char *)__s,local_578[1].marker);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eae3;
  pfStack_590 = (fdb_kvs_handle *)0x10e98e;
  fVar3 = fdb_snapshot_open((fdb_kvs_handle *)local_558._40_8_,(fdb_kvs_handle **)(local_558 + 0x18)
                            ,local_578[1].kvs_markers[1].seqnum);
  if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0010e996;
LAB_0010eae8:
  pfStack_590 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_a88 = (fdb_kvs_handle *)0x10eb0a;
  pcStack_5b8 = __s;
  pfStack_5b0 = handle;
  pfStack_5a8 = doc;
  pcStack_5a0 = pcVar17;
  lStack_598 = lVar20;
  pfStack_590 = pfVar8;
  gettimeofday((timeval *)(auStack_a30 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_a88 = (fdb_kvs_handle *)0x10eb0f;
  memleak_start();
  pfStack_a88 = (fdb_kvs_handle *)0x10eb1b;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_a88 = (fdb_kvs_handle *)0x10eb2b;
  fdb_get_default_config();
  config_00 = (btree *)auStack_a30;
  pfStack_a88 = (fdb_kvs_handle *)0x10eb38;
  fdb_get_default_kvs_config();
  auStack_9c0[0x110] = '\0';
  auStack_9c0[0x111] = '\0';
  auStack_9c0[0x112] = '\0';
  auStack_9c0[0x113] = '\x01';
  auStack_9c0[0x114] = '\0';
  auStack_9c0[0x115] = '\0';
  auStack_9c0[0x116] = '\0';
  auStack_9c0[0x117] = '\0';
  auStack_9c0[0x118] = '\0';
  auStack_9c0[0x119] = '\x04';
  auStack_9c0[0x11a] = '\0';
  auStack_9c0[0x11b] = '\0';
  auStack_9c0[0x11c] = '\0';
  auStack_9c0[0x11d] = '\0';
  auStack_9c0[0x11e] = '\0';
  auStack_9c0[0x11f] = '\0';
  auStack_9c0._300_4_ = 1;
  auStack_9c0[0x137] = 0;
  ptr_fhandle_00 = (btree *)&pfStack_a68;
  pfStack_a88 = (fdb_kvs_handle *)0x10eb6a;
  fdb_open((fdb_file_handle **)ptr_fhandle_00,"./compact_test1",(fdb_config *)(auStack_9c0 + 0x108))
  ;
  ppfVar10 = &pfStack_a70;
  pfStack_a88 = (fdb_kvs_handle *)0x10eb7d;
  fdb_kvs_open_default(pfStack_a68,ppfVar10,(fdb_kvs_config *)config_00);
  pfStack_a88 = (fdb_kvs_handle *)0x10eb93;
  fVar3 = fdb_set_log_callback(pfStack_a70,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_a88 = (fdb_kvs_handle *)0x10ebb7;
    fdb_open((fdb_file_handle **)auStack_a58,"./compact_test1",(fdb_config *)(auStack_9c0 + 0x108));
    ppfVar10 = &pfStack_a60;
    pfStack_a88 = (fdb_kvs_handle *)0x10ebcc;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_a58._0_8_,ppfVar10,(fdb_kvs_config *)auStack_a30);
    pfStack_a88 = (fdb_kvs_handle *)0x10ebe2;
    fVar3 = fdb_set_log_callback(pfStack_a60,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010efd1;
    lVar20 = 0;
    uVar16 = 0;
    do {
      pfStack_a88 = (fdb_kvs_handle *)0x10ec0a;
      sprintf(acStack_6c0,"key%d",uVar16 & 0xffffffff);
      pfStack_a88 = (fdb_kvs_handle *)0x10ec22;
      sprintf(auStack_9c0 + 0x200,"meta%d",uVar16 & 0xffffffff);
      pfStack_a88 = (fdb_kvs_handle *)0x10ec3a;
      sprintf(auStack_9c0,"body%d",uVar16 & 0xffffffff);
      pfStack_a88 = (fdb_kvs_handle *)0x10ec4a;
      sVar5 = strlen(acStack_6c0);
      pfStack_a88 = (fdb_kvs_handle *)0x10ec5d;
      sVar6 = strlen(auStack_9c0 + 0x200);
      pfStack_a88 = (fdb_kvs_handle *)0x10ec6d;
      sVar7 = strlen(auStack_9c0);
      pfStack_a88 = (fdb_kvs_handle *)0x10ec92;
      fdb_doc_create((fdb_doc **)(auStack_a58 + lVar20 + 8),acStack_6c0,sVar5,auStack_9c0 + 0x200,
                     sVar6,auStack_9c0,sVar7);
      pfStack_a88 = (fdb_kvs_handle *)0x10eca1;
      fdb_set(pfStack_a70,*(fdb_doc **)(auStack_a58 + uVar16 * 8 + 8));
      uVar16 = uVar16 + 1;
      lVar20 = lVar20 + 8;
    } while (uVar16 == 1);
    pfStack_a88 = (fdb_kvs_handle *)0x10ece2;
    fdb_doc_create((fdb_doc **)&pfStack_a78,*(void **)(auStack_a58._16_8_ + 0x20),
                   *(size_t *)auStack_a58._16_8_,*(void **)(auStack_a58._16_8_ + 0x38),
                   *(size_t *)(auStack_a58._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_a78->file = true;
    pfStack_a88 = (fdb_kvs_handle *)0x10ecf3;
    fdb_set(pfStack_a70,(fdb_doc *)pfStack_a78);
    pfStack_a88 = (fdb_kvs_handle *)0x10ecfb;
    fdb_doc_free((fdb_doc *)pfStack_a78);
    pfStack_a88 = (fdb_kvs_handle *)0x10ed0a;
    fdb_commit(pfStack_a68,'\x01');
    pfStack_a88 = (fdb_kvs_handle *)0x10ed1b;
    fdb_compact(pfStack_a68,"./compact_test2");
    pfStack_a88 = (fdb_kvs_handle *)0x10ed27;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_a88 = (fdb_kvs_handle *)0x10ed45;
    sprintf(acStack_6c0,"key%d",2);
    ptr_fhandle_00 = (btree *)(auStack_9c0 + 0x200);
    pfStack_a88 = (fdb_kvs_handle *)0x10ed63;
    sprintf((char *)ptr_fhandle_00,"meta%d",2);
    handle = (fdb_kvs_handle *)auStack_9c0;
    pfStack_a88 = (fdb_kvs_handle *)0x10ed81;
    sprintf((char *)handle,"body%d",2);
    pfStack_a88 = (fdb_kvs_handle *)0x10ed89;
    doc = (fdb_kvs_handle *)strlen(acStack_6c0);
    pfStack_a88 = (fdb_kvs_handle *)0x10ed94;
    pfVar8 = (fdb_kvs_handle *)strlen((char *)ptr_fhandle_00);
    pfStack_a88 = (fdb_kvs_handle *)0x10ed9f;
    sVar5 = strlen((char *)handle);
    pfStack_a88 = (fdb_kvs_handle *)0x10edba;
    fdb_doc_create((fdb_doc **)(auStack_a58 + 0x18),acStack_6c0,(size_t)doc,ptr_fhandle_00,
                   (size_t)pfVar8,handle,sVar5);
    pfStack_a88 = (fdb_kvs_handle *)0x10edc7;
    fdb_set(pfStack_a70,(fdb_doc *)auStack_a58._24_8_);
    pfStack_a88 = (fdb_kvs_handle *)0x10edd6;
    fdb_commit(pfStack_a68,'\x01');
    pfStack_a88 = (fdb_kvs_handle *)0x10ede0;
    fdb_kvs_close(pfStack_a70);
    ppfVar10 = &pfStack_a60;
    pfStack_a88 = (fdb_kvs_handle *)0x10eded;
    fdb_kvs_close(pfStack_a60);
    pfStack_a88 = (fdb_kvs_handle *)0x10edf7;
    fdb_close(pfStack_a68);
    config_00 = (btree *)auStack_a58;
    pfStack_a88 = (fdb_kvs_handle *)0x10ee04;
    fdb_close((fdb_file_handle *)auStack_a58._0_8_);
    pfStack_a88 = (fdb_kvs_handle *)0x10ee10;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_a88 = (fdb_kvs_handle *)0x10ee27;
    fdb_open((fdb_file_handle **)config_00,"./compact_test1",(fdb_config *)(auStack_9c0 + 0x108));
    pfStack_a88 = (fdb_kvs_handle *)0x10ee37;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_a58._0_8_,ppfVar10,(fdb_kvs_config *)auStack_a30);
    pfStack_a88 = (fdb_kvs_handle *)0x10ee4d;
    fVar3 = fdb_set_log_callback(pfStack_a60,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      handle = (fdb_kvs_handle *)0x0;
      ppfVar10 = &pfStack_a78;
      while( true ) {
        pfStack_a88 = (fdb_kvs_handle *)0x10ee81;
        fdb_doc_create((fdb_doc **)ppfVar10,
                       (void *)(*(size_t **)(auStack_a58 + (long)handle * 8 + 8))[4],
                       **(size_t **)(auStack_a58 + (long)handle * 8 + 8),(void *)0x0,0,(void *)0x0,0
                      );
        pfStack_a88 = (fdb_kvs_handle *)0x10ee90;
        fVar3 = fdb_get(pfStack_a60,(fdb_doc *)pfStack_a78);
        pfVar11 = pfStack_a78;
        if (handle != (fdb_kvs_handle *)0x1) break;
        pfVar11 = doc;
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010efc7;
LAB_0010eef0:
        pfStack_a88 = (fdb_kvs_handle *)0x10eefa;
        fdb_doc_free((fdb_doc *)pfStack_a78);
        handle = (fdb_kvs_handle *)&(handle->kvs_config).field_0x1;
        doc = pfVar11;
        if (handle == (fdb_kvs_handle *)0x3) {
          pfStack_a88 = (fdb_kvs_handle *)0x10ef19;
          fdb_get_file_info((fdb_file_handle *)auStack_a58._0_8_,&fStack_a08);
          pfStack_a88 = (fdb_kvs_handle *)0x10ef28;
          iVar4 = strcmp("./compact_test2",fStack_a08.filename);
          if (iVar4 != 0) {
            pfStack_a88 = (fdb_kvs_handle *)0x10ef36;
            auto_recover_compact_ok_test();
          }
          pfStack_a88 = (fdb_kvs_handle *)0x10ef40;
          fdb_kvs_close(pfStack_a60);
          pfStack_a88 = (fdb_kvs_handle *)0x10ef4a;
          fdb_close((fdb_file_handle *)auStack_a58._0_8_);
          lVar20 = 0;
          do {
            pfStack_a88 = (fdb_kvs_handle *)0x10ef56;
            fdb_doc_free(*(fdb_doc **)(auStack_a58 + lVar20 * 8 + 8));
            lVar20 = lVar20 + 1;
          } while (lVar20 != 3);
          pfStack_a88 = (fdb_kvs_handle *)0x10ef64;
          fdb_shutdown();
          pfStack_a88 = (fdb_kvs_handle *)0x10ef69;
          memleak_end();
          pcVar17 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar17 = "%s FAILED\n";
          }
          pfStack_a88 = (fdb_kvs_handle *)0x10ef9a;
          fprintf(_stderr,pcVar17,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar3 == FDB_RESULT_SUCCESS) {
        config_00 = pfStack_a78->staletree;
        pfVar8 = *(fdb_kvs_handle **)(auStack_a58 + (long)handle * 8 + 8);
        ptr_fhandle_00 = pfVar8->staletree;
        pfStack_a88 = (fdb_kvs_handle *)0x10eec9;
        iVar4 = bcmp(config_00,ptr_fhandle_00,(size_t)(pfStack_a78->kvs_config).custom_cmp);
        if (iVar4 == 0) {
          config_00 = (pfVar11->field_6).seqtree;
          ptr_fhandle_00 = (pfVar8->field_6).seqtree;
          pfStack_a88 = (fdb_kvs_handle *)0x10eee8;
          iVar4 = bcmp(config_00,ptr_fhandle_00,(size_t)(pfVar11->kvs_config).custom_cmp_param);
          if (iVar4 == 0) goto LAB_0010eef0;
          pfStack_a88 = (fdb_kvs_handle *)0x10efb7;
          auto_recover_compact_ok_test();
          doc = pfVar11;
          goto LAB_0010efb7;
        }
      }
      else {
LAB_0010efb7:
        pfVar11 = doc;
        pfStack_a88 = (fdb_kvs_handle *)0x10efbc;
        auto_recover_compact_ok_test();
      }
      pfStack_a88 = (fdb_kvs_handle *)0x10efc7;
      auto_recover_compact_ok_test();
      doc = pfVar11;
LAB_0010efc7:
      pfStack_a88 = (fdb_kvs_handle *)0x10efcc;
      auto_recover_compact_ok_test();
      goto LAB_0010efcc;
    }
  }
  else {
LAB_0010efcc:
    pfStack_a88 = (fdb_kvs_handle *)0x10efd1;
    auto_recover_compact_ok_test();
LAB_0010efd1:
    pfStack_a88 = (fdb_kvs_handle *)0x10efd6;
    auto_recover_compact_ok_test();
  }
  pfStack_a88 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_ff0 = (fdb_kvs_handle *)0x10effb;
  ppfStack_ab0 = ppfVar10;
  pfStack_aa8 = handle;
  pfStack_aa0 = doc;
  pbStack_a98 = config_00;
  pbStack_a90 = ptr_fhandle_00;
  pfStack_a88 = pfVar8;
  gettimeofday(&tStack_f60,(__timezone_ptr_t)0x0);
  pfStack_ff0 = (fdb_kvs_handle *)0x10f000;
  memleak_start();
  pfStack_ff0 = (fdb_kvs_handle *)0x10f00c;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_ff0 = (fdb_kvs_handle *)0x10f01c;
  fdb_get_default_config();
  config = &fStack_f50;
  pfStack_ff0 = (fdb_kvs_handle *)0x10f02c;
  fdb_get_default_kvs_config();
  fStack_ba8.buffercache_size = 0x1000000;
  fStack_ba8.wal_threshold = 0x400;
  fStack_ba8.flags = 1;
  fStack_ba8.compaction_threshold = '\0';
  doc_00 = &pfStack_fc8;
  pfStack_ff0 = (fdb_kvs_handle *)0x10f05e;
  fdb_open((fdb_file_handle **)doc_00,"./compact_test1",&fStack_ba8);
  ppfVar10 = &pfStack_fd0;
  pfStack_ff0 = (fdb_kvs_handle *)0x10f071;
  fdb_kvs_open_default((fdb_file_handle *)pfStack_fc8,ppfVar10,config);
  pfStack_ff0 = (fdb_kvs_handle *)0x10f087;
  fVar3 = fdb_set_log_callback(pfStack_fd0,logCallbackFunc,"unlink_after_compaction_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    handle = (fdb_kvs_handle *)0x0;
    uVar16 = 0;
    do {
      pfStack_ff0 = (fdb_kvs_handle *)0x10f0af;
      sprintf(auStack_e38 + 0x100,"key%d",uVar16 & 0xffffffff);
      pfStack_ff0 = (fdb_kvs_handle *)0x10f0c7;
      sprintf(auStack_e38,"meta%d",uVar16 & 0xffffffff);
      pfStack_ff0 = (fdb_kvs_handle *)0x10f0df;
      sprintf(acStack_f38,"body%d",uVar16 & 0xffffffff);
      doc_00 = (fdb_doc **)((long)apfStack_fb8 + (long)handle);
      pfStack_ff0 = (fdb_kvs_handle *)0x10f0ef;
      doc = (fdb_kvs_handle *)strlen(auStack_e38 + 0x100);
      pfVar8 = (fdb_kvs_handle *)auStack_e38;
      pfStack_ff0 = (fdb_kvs_handle *)0x10f102;
      config = (fdb_kvs_config *)strlen((char *)pfVar8);
      pfStack_ff0 = (fdb_kvs_handle *)0x10f112;
      sVar5 = strlen(acStack_f38);
      pfStack_ff0 = (fdb_kvs_handle *)0x10f137;
      fdb_doc_create(doc_00,auStack_e38 + 0x100,(size_t)doc,pfVar8,(size_t)config,acStack_f38,sVar5)
      ;
      pfStack_ff0 = (fdb_kvs_handle *)0x10f146;
      fdb_set(pfStack_fd0,apfStack_fb8[uVar16]);
      uVar16 = uVar16 + 1;
      handle = (fdb_kvs_handle *)((long)handle + 8);
    } while (uVar16 != 10);
    pfStack_ff0 = (fdb_kvs_handle *)0x10f166;
    fdb_commit((fdb_file_handle *)pfStack_fc8,'\x01');
    pfStack_ff0 = (fdb_kvs_handle *)0x10f17a;
    fVar3 = fdb_snapshot_open(pfStack_fd0,&pfStack_fc0,10);
    ppfVar10 = (fdb_kvs_handle **)0xa;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f2df;
    pfStack_ff0 = (fdb_kvs_handle *)0x10f193;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_fc8,"./compact_test2");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      config = (fdb_kvs_config *)0x0;
      do {
        pfStack_ff0 = (fdb_kvs_handle *)0x10f1c7;
        fdb_doc_create((fdb_doc **)&pfStack_fd8,apfStack_fb8[(long)config]->key,
                       apfStack_fb8[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_ff0 = (fdb_kvs_handle *)0x10f1d6;
        fVar3 = fdb_get(pfStack_fd0,(fdb_doc *)pfStack_fd8);
        if (fVar3 != FDB_RESULT_SUCCESS) {
          pfStack_ff0 = (fdb_kvs_handle *)0x10f2d5;
          unlink_after_compaction_test();
          goto LAB_0010f2d5;
        }
        pfStack_ff0 = (fdb_kvs_handle *)0x10f1e8;
        fdb_doc_free((fdb_doc *)pfStack_fd8);
        config = (fdb_kvs_config *)&config->field_0x1;
      } while (config != (fdb_kvs_config *)0xa);
      pfStack_ff0 = (fdb_kvs_handle *)0x10f205;
      iVar4 = stat("./compact_test1",(stat *)(auStack_e38 + 0x200));
      if (iVar4 == 0) {
        pfStack_ff0 = (fdb_kvs_handle *)0x10f20e;
        unlink_after_compaction_test();
      }
      config = (fdb_kvs_config *)0x0;
      while( true ) {
        pfStack_ff0 = (fdb_kvs_handle *)0x10f23a;
        fdb_doc_create((fdb_doc **)&pfStack_fd8,apfStack_fb8[(long)config]->key,
                       apfStack_fb8[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_ff0 = (fdb_kvs_handle *)0x10f249;
        fVar3 = fdb_get(pfStack_fc0,(fdb_doc *)pfStack_fd8);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        pfStack_ff0 = (fdb_kvs_handle *)0x10f25b;
        fdb_doc_free((fdb_doc *)pfStack_fd8);
        config = (fdb_kvs_config *)&config->field_0x1;
        if (config == (fdb_kvs_config *)0xa) {
          pfStack_ff0 = (fdb_kvs_handle *)0x10f26e;
          fdb_close((fdb_file_handle *)pfStack_fc8);
          pfStack_ff0 = (fdb_kvs_handle *)0x10f273;
          fdb_shutdown();
          lVar20 = 0;
          do {
            pfStack_ff0 = (fdb_kvs_handle *)0x10f27f;
            fdb_doc_free(apfStack_fb8[lVar20]);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 10);
          pfStack_ff0 = (fdb_kvs_handle *)0x10f28d;
          memleak_end();
          pcVar17 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar17 = "%s FAILED\n";
          }
          pfStack_ff0 = (fdb_kvs_handle *)0x10f2be;
          fprintf(_stderr,pcVar17,"unlink after compaction test");
          return;
        }
      }
LAB_0010f2d5:
      ppfVar10 = &pfStack_fd8;
      pfStack_ff0 = (fdb_kvs_handle *)0x10f2da;
      unlink_after_compaction_test();
      goto LAB_0010f2da;
    }
  }
  else {
LAB_0010f2da:
    pfStack_ff0 = (fdb_kvs_handle *)0x10f2df;
    unlink_after_compaction_test();
LAB_0010f2df:
    pfStack_ff0 = (fdb_kvs_handle *)0x10f2e4;
    unlink_after_compaction_test();
  }
  pfStack_ff0 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_1788 = (fdb_kvs_handle *)0x10f309;
  ppfStack_1018 = ppfVar10;
  pfStack_1010 = handle;
  pfStack_1008 = doc;
  pfStack_1000 = config;
  ppfStack_ff8 = doc_00;
  pfStack_ff0 = pfVar8;
  gettimeofday(&tStack_1700,(__timezone_ptr_t)0x0);
  pfStack_1788 = (fdb_kvs_handle *)0x10f30e;
  memleak_start();
  pfStack_1788 = (fdb_kvs_handle *)0x10f31a;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1788 = (fdb_kvs_handle *)0x10f32a;
  fdb_get_default_config();
  info = (fdb_kvs_info *)auStack_1748;
  pfStack_1788 = (fdb_kvs_handle *)0x10f337;
  fdb_get_default_kvs_config();
  fStack_14f8.buffercache_size = 0x1000000;
  fStack_14f8.wal_threshold = 0x400;
  fStack_14f8.flags = 1;
  fStack_14f8.compaction_threshold = '\0';
  _Var21._M_i = (__int_type_conflict)(auStack_1760 + 0x10);
  pfStack_1788 = (fdb_kvs_handle *)0x10f369;
  fdb_open((fdb_file_handle **)_Var21._M_i,"./compact_test1",&fStack_14f8);
  ppfVar10 = (fdb_kvs_handle **)auStack_1760;
  pfStack_1788 = (fdb_kvs_handle *)0x10f37e;
  fdb_kvs_open((fdb_file_handle *)auStack_1760._16_8_,ppfVar10,(char *)0x0,(fdb_kvs_config *)info);
  pfStack_1788 = (fdb_kvs_handle *)0x10f394;
  pfVar11 = (fdb_kvs_handle *)auStack_1760._0_8_;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1760._0_8_,logCallbackFunc,"db_destroy_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    handle = (fdb_kvs_handle *)0x0;
    uVar16 = 0;
    do {
      pfStack_1788 = (fdb_kvs_handle *)0x10f3bc;
      sprintf(auStack_1400 + 0x100,"key%d",uVar16 & 0xffffffff);
      pfStack_1788 = (fdb_kvs_handle *)0x10f3d4;
      sprintf(auStack_1400,"meta%d",uVar16 & 0xffffffff);
      pfStack_1788 = (fdb_kvs_handle *)0x10f3ec;
      sprintf(acStack_16f0,"body%d",uVar16 & 0xffffffff);
      _Var21._M_i = (long)apfStack_15f0 + (long)handle;
      pfStack_1788 = (fdb_kvs_handle *)0x10f3ff;
      doc = (fdb_kvs_handle *)strlen(auStack_1400 + 0x100);
      pfVar8 = (fdb_kvs_handle *)auStack_1400;
      pfStack_1788 = (fdb_kvs_handle *)0x10f412;
      info = (fdb_kvs_info *)strlen((char *)pfVar8);
      pfStack_1788 = (fdb_kvs_handle *)0x10f422;
      sVar5 = strlen(acStack_16f0);
      pfStack_1788 = (fdb_kvs_handle *)0x10f447;
      fdb_doc_create((fdb_doc **)_Var21._M_i,auStack_1400 + 0x100,(size_t)doc,pfVar8,(size_t)info,
                     acStack_16f0,sVar5);
      pfStack_1788 = (fdb_kvs_handle *)0x10f459;
      fdb_set((fdb_kvs_handle *)auStack_1760._0_8_,apfStack_15f0[uVar16]);
      uVar16 = uVar16 + 1;
      handle = (fdb_kvs_handle *)((long)handle + 8);
    } while (uVar16 != 0x1e);
    pfStack_1788 = (fdb_kvs_handle *)0x10f476;
    fdb_commit((fdb_file_handle *)auStack_1760._16_8_,'\0');
    pfStack_1788 = (fdb_kvs_handle *)0x10f492;
    fdb_open((fdb_file_handle **)(auStack_1760 + 8),"./compact_test1.1",&fStack_14f8);
    ppfVar10 = (fdb_kvs_handle **)(auStack_1770 + 8);
    pfStack_1788 = (fdb_kvs_handle *)0x10f4a9;
    fdb_kvs_open((fdb_file_handle *)auStack_1760._8_8_,ppfVar10,(char *)0x0,
                 (fdb_kvs_config *)auStack_1748);
    pfStack_1788 = (fdb_kvs_handle *)0x10f4bf;
    pfVar11 = (fdb_kvs_handle *)auStack_1770._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_1770._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f903;
    handle = (fdb_kvs_handle *)0x0;
    uVar16 = 0;
    do {
      pfStack_1788 = (fdb_kvs_handle *)0x10f4e7;
      sprintf(auStack_1400 + 0x100,"k2ey%d",uVar16 & 0xffffffff);
      pfStack_1788 = (fdb_kvs_handle *)0x10f4ff;
      sprintf(auStack_1400,"m2eta%d",uVar16 & 0xffffffff);
      pfStack_1788 = (fdb_kvs_handle *)0x10f517;
      sprintf(acStack_16f0,"b2ody%d",uVar16 & 0xffffffff);
      _Var21._M_i = (__int_type_conflict)(auStack_1400 + (long)handle + 0x200);
      pfStack_1788 = (fdb_kvs_handle *)0x10f52a;
      doc = (fdb_kvs_handle *)strlen(auStack_1400 + 0x100);
      pfVar8 = (fdb_kvs_handle *)auStack_1400;
      pfStack_1788 = (fdb_kvs_handle *)0x10f53d;
      info = (fdb_kvs_info *)strlen((char *)pfVar8);
      pfStack_1788 = (fdb_kvs_handle *)0x10f54d;
      sVar5 = strlen(acStack_16f0);
      pfStack_1788 = (fdb_kvs_handle *)0x10f572;
      fdb_doc_create((fdb_doc **)_Var21._M_i,auStack_1400 + 0x100,(size_t)doc,pfVar8,(size_t)info,
                     acStack_16f0,sVar5);
      pfStack_1788 = (fdb_kvs_handle *)0x10f584;
      fdb_set((fdb_kvs_handle *)auStack_1770._8_8_,(fdb_doc *)auStack_1110[uVar16 - 0x1e]);
      uVar16 = uVar16 + 1;
      handle = (fdb_kvs_handle *)((long)handle + 8);
    } while (uVar16 != 0x3c);
    pfStack_1788 = (fdb_kvs_handle *)0x10f5a1;
    fdb_commit((fdb_file_handle *)auStack_1760._8_8_,'\0');
    pfStack_1788 = (fdb_kvs_handle *)0x10f5b0;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1770._8_8_,(fdb_kvs_info *)(auStack_1748 + 0x18));
    ppfVar10 = apfStack_1728;
    if (apfStack_1728[0] != (fdb_kvs_handle *)0x3c) {
      pfStack_1788 = (fdb_kvs_handle *)0x10f5c3;
      db_compact_overwrite();
    }
    pfStack_1788 = (fdb_kvs_handle *)0x10f5cd;
    fdb_kvs_close((fdb_kvs_handle *)auStack_1770._8_8_);
    pfStack_1788 = (fdb_kvs_handle *)0x10f5d7;
    fdb_close((fdb_file_handle *)auStack_1760._8_8_);
    pfStack_1788 = (fdb_kvs_handle *)0x10f5e3;
    pfVar11 = (fdb_kvs_handle *)auStack_1760._16_8_;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_1760._16_8_,(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f908;
    info = (fdb_kvs_info *)auStack_1760;
    pfStack_1788 = (fdb_kvs_handle *)0x10f5f8;
    fdb_kvs_close((fdb_kvs_handle *)auStack_1760._0_8_);
    _Var21._M_i = (__int_type_conflict)(auStack_1760 + 0x10);
    pfStack_1788 = (fdb_kvs_handle *)0x10f605;
    fdb_close((fdb_file_handle *)auStack_1760._16_8_);
    pfStack_1788 = (fdb_kvs_handle *)0x10f61c;
    fdb_open((fdb_file_handle **)_Var21._M_i,"./compact_test1",&fStack_14f8);
    pfStack_1788 = (fdb_kvs_handle *)0x10f62e;
    fdb_kvs_open((fdb_file_handle *)auStack_1760._16_8_,(fdb_kvs_handle **)info,(char *)0x0,
                 (fdb_kvs_config *)auStack_1748);
    pfStack_1788 = (fdb_kvs_handle *)0x10f644;
    pfVar11 = (fdb_kvs_handle *)auStack_1760._0_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_1760._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f90d;
    handle = (fdb_kvs_handle *)0x0;
    info = (fdb_kvs_info *)auStack_1770;
    do {
      pfStack_1788 = (fdb_kvs_handle *)0x10f67b;
      fdb_doc_create((fdb_doc **)info,(void *)(*(size_t **)((long)apfStack_15f0 + (long)handle))[4],
                     **(size_t **)((long)apfStack_15f0 + (long)handle),(void *)0x0,0,(void *)0x0,0);
      pfStack_1788 = (fdb_kvs_handle *)0x10f68a;
      pfVar11 = (fdb_kvs_handle *)auStack_1760._0_8_;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_1760._0_8_,(fdb_doc *)auStack_1770._0_8_);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1788 = (fdb_kvs_handle *)0x10f8f9;
        db_compact_overwrite();
        goto LAB_0010f8f9;
      }
      _Var21._M_i = (long)apfStack_15f0 + (long)handle;
      pfStack_1788 = (fdb_kvs_handle *)0x10f6b6;
      iVar4 = bcmp(*(btree **)(auStack_1770._0_8_ + 0x38),(*(fdb_doc **)_Var21._M_i)->meta,
                   (size_t)((fdb_kvs_config *)auStack_1770._0_8_)->custom_cmp);
      if (iVar4 != 0) {
        pfStack_1788 = (fdb_kvs_handle *)0x10f6ff;
        db_compact_overwrite();
      }
      pfStack_1788 = (fdb_kvs_handle *)0x10f6d3;
      iVar4 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1770._0_8_ + 0x40))->
                   seqtree,(*(fdb_doc **)_Var21._M_i)->body,
                   (size_t)((fdb_kvs_config *)auStack_1770._0_8_)->custom_cmp_param);
      if (iVar4 != 0) {
        pfStack_1788 = (fdb_kvs_handle *)0x10f70c;
        db_compact_overwrite();
      }
      pfStack_1788 = (fdb_kvs_handle *)0x10f6e1;
      fdb_doc_free((fdb_doc *)auStack_1770._0_8_);
      handle = (fdb_kvs_handle *)&(handle->kvs_config).custom_cmp;
    } while (handle != (fdb_kvs_handle *)0xf0);
    pfStack_1788 = (fdb_kvs_handle *)0x10f72a;
    fdb_open((fdb_file_handle **)(auStack_1760 + 8),"./compact_test1.1",&fStack_14f8);
    info = (fdb_kvs_info *)(auStack_1770 + 8);
    pfStack_1788 = (fdb_kvs_handle *)0x10f741;
    fdb_kvs_open((fdb_file_handle *)auStack_1760._8_8_,(fdb_kvs_handle **)info,(char *)0x0,
                 (fdb_kvs_config *)auStack_1748);
    pfStack_1788 = (fdb_kvs_handle *)0x10f757;
    pfVar11 = (fdb_kvs_handle *)auStack_1770._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_1770._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      info = (fdb_kvs_info *)(auStack_1748 + 0x18);
      pfStack_1788 = (fdb_kvs_handle *)0x10f771;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_1770._8_8_,info);
      if (apfStack_1728[0] != (fdb_kvs_handle *)0x3c) {
        pfStack_1788 = (fdb_kvs_handle *)0x10f780;
        db_compact_overwrite();
      }
      _Var21._M_i = 0;
      ppfVar10 = (fdb_kvs_handle **)auStack_1770;
      while( true ) {
        pfStack_1788 = (fdb_kvs_handle *)0x10f7af;
        fdb_doc_create((fdb_doc **)ppfVar10,
                       (void *)(*(size_t **)(auStack_1400 + 0x200 + _Var21._M_i))[4],
                       **(size_t **)(auStack_1400 + 0x200 + _Var21._M_i),(void *)0x0,0,(void *)0x0,0
                      );
        pfStack_1788 = (fdb_kvs_handle *)0x10f7be;
        pfVar11 = (fdb_kvs_handle *)auStack_1770._8_8_;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_1770._8_8_,(fdb_doc *)auStack_1770._0_8_);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        info = (fdb_kvs_info *)(auStack_1400 + 0x200 + _Var21._M_i);
        pfStack_1788 = (fdb_kvs_handle *)0x10f7ea;
        iVar4 = bcmp(*(btree **)(auStack_1770._0_8_ + 0x38),*(void **)(info->name + 0x38),
                     (size_t)((fdb_kvs_config *)auStack_1770._0_8_)->custom_cmp);
        if (iVar4 != 0) {
          pfStack_1788 = (fdb_kvs_handle *)0x10f833;
          db_compact_overwrite();
        }
        pfStack_1788 = (fdb_kvs_handle *)0x10f807;
        iVar4 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1770._0_8_ + 0x40))
                     ->seqtree,*(void **)(info->name + 0x40),
                     (size_t)((fdb_kvs_config *)auStack_1770._0_8_)->custom_cmp_param);
        if (iVar4 != 0) {
          pfStack_1788 = (fdb_kvs_handle *)0x10f840;
          db_compact_overwrite();
        }
        pfStack_1788 = (fdb_kvs_handle *)0x10f815;
        fdb_doc_free((fdb_doc *)auStack_1770._0_8_);
        _Var21._M_i = _Var21._M_i + 8;
        if ((fdb_doc **)_Var21._M_i == (fdb_doc **)0x1e0) {
          lVar20 = 0;
          do {
            pfStack_1788 = (fdb_kvs_handle *)0x10f851;
            fdb_doc_free(apfStack_15f0[lVar20]);
            pfStack_1788 = (fdb_kvs_handle *)0x10f85e;
            fdb_doc_free((fdb_doc *)auStack_1110[lVar20 + -0x1e]);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0x1e);
          lVar20 = 0;
          do {
            pfStack_1788 = (fdb_kvs_handle *)0x10f876;
            fdb_doc_free((fdb_doc *)auStack_1110[lVar20]);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0x1e);
          pfStack_1788 = (fdb_kvs_handle *)0x10f889;
          fdb_kvs_close((fdb_kvs_handle *)auStack_1760._0_8_);
          pfStack_1788 = (fdb_kvs_handle *)0x10f893;
          fdb_close((fdb_file_handle *)auStack_1760._16_8_);
          pfStack_1788 = (fdb_kvs_handle *)0x10f89d;
          fdb_kvs_close((fdb_kvs_handle *)auStack_1770._8_8_);
          pfStack_1788 = (fdb_kvs_handle *)0x10f8a7;
          fdb_close((fdb_file_handle *)auStack_1760._8_8_);
          pfStack_1788 = (fdb_kvs_handle *)0x10f8ac;
          fdb_shutdown();
          pfStack_1788 = (fdb_kvs_handle *)0x10f8b1;
          memleak_end();
          pcVar17 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar17 = "%s FAILED\n";
          }
          pfStack_1788 = (fdb_kvs_handle *)0x10f8e2;
          fprintf(_stderr,pcVar17,"compact overwrite");
          return;
        }
      }
LAB_0010f8f9:
      pfStack_1788 = (fdb_kvs_handle *)0x10f8fe;
      db_compact_overwrite();
      goto LAB_0010f8fe;
    }
  }
  else {
LAB_0010f8fe:
    pfStack_1788 = (fdb_kvs_handle *)0x10f903;
    db_compact_overwrite();
LAB_0010f903:
    pfStack_1788 = (fdb_kvs_handle *)0x10f908;
    db_compact_overwrite();
LAB_0010f908:
    pfStack_1788 = (fdb_kvs_handle *)0x10f90d;
    db_compact_overwrite();
LAB_0010f90d:
    pfStack_1788 = (fdb_kvs_handle *)0x10f912;
    db_compact_overwrite();
  }
  pfStack_1788 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  pfStack_1f60 = (fdb_kvs_handle *)0x10f937;
  ppfStack_17b0 = ppfVar10;
  pfStack_17a8 = handle;
  pfStack_17a0 = doc;
  pfStack_1798 = info;
  ppfStack_1790 = (fdb_doc **)_Var21._M_i;
  pfStack_1788 = pfVar8;
  gettimeofday(&tStack_1ee0,(__timezone_ptr_t)0x0);
  pfStack_1f60 = (fdb_kvs_handle *)0x10f93c;
  memleak_start();
  pfStack_1f60 = (fdb_kvs_handle *)0x10f946;
  fdb_get_default_kvs_config();
  pfVar13 = (fdb_kvs_handle *)auStack_1ed0;
  pfStack_1f60 = (fdb_kvs_handle *)0x10f956;
  fdb_get_default_config();
  auStack_1ed0._8_8_ = (list *)0x0;
  auStack_1ed0._16_8_ = (list *)0x400;
  auStack_1ed0[0x2f] = '\0';
  if (pfVar11 == (fdb_kvs_handle *)0x0) {
    pfStack_1f60 = (fdb_kvs_handle *)0x10f980;
    system("rm -rf  compact_test* > errorlog.txt");
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_1f48;
    pfStack_1f60 = (fdb_kvs_handle *)0x10f999;
    fVar3 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_1ed0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_1f60 = (fdb_kvs_handle *)0x10f9b5;
      ptr_fhandle = pfStack_1f48;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_1f48,&pfStack_1f40,&fStack_1f28);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fc6b;
      lVar20 = 0;
      uVar16 = 0;
      do {
        pfStack_1f60 = (fdb_kvs_handle *)0x10f9dd;
        sprintf(acStack_1bd8,"key%d",uVar16 & 0xffffffff);
        pfStack_1f60 = (fdb_kvs_handle *)0x10f9f5;
        sprintf(auStack_1ed0 + 0x1f8,"meta%d",uVar16 & 0xffffffff);
        pfStack_1f60 = (fdb_kvs_handle *)0x10fa0d;
        sprintf(auStack_1ed0 + 0xf8,"body%d",uVar16 & 0xffffffff);
        pfStack_1f60 = (fdb_kvs_handle *)0x10fa20;
        doc = (fdb_kvs_handle *)strlen(acStack_1bd8);
        pfVar8 = (fdb_kvs_handle *)(auStack_1ed0 + 0x1f8);
        pfStack_1f60 = (fdb_kvs_handle *)0x10fa33;
        sVar5 = strlen((char *)pfVar8);
        pfStack_1f60 = (fdb_kvs_handle *)0x10fa43;
        sVar6 = strlen(auStack_1ed0 + 0xf8);
        pfStack_1f60 = (fdb_kvs_handle *)0x10fa68;
        fdb_doc_create((fdb_doc **)((long)apfStack_1ad8 + lVar20),acStack_1bd8,(size_t)doc,pfVar8,
                       sVar5,auStack_1ed0 + 0xf8,sVar6);
        pfStack_1f60 = (fdb_kvs_handle *)0x10fa7a;
        fdb_set(pfStack_1f40,apfStack_1ad8[uVar16]);
        uVar16 = uVar16 + 1;
        lVar20 = lVar20 + 8;
      } while (uVar16 != 100);
      pfStack_1f60 = (fdb_kvs_handle *)0x10fa97;
      fdb_commit((fdb_file_handle *)pfStack_1f48,'\0');
      pfStack_1f60 = (fdb_kvs_handle *)0x10faa6;
      fdb_get_kvs_info(pfStack_1f40,(fdb_kvs_info *)auStack_1f10);
      pfVar11 = (fdb_kvs_handle *)(auStack_1f10 + 0x10);
      if ((filemgr *)auStack_1f10._16_8_ != (filemgr *)0x64) {
        pfStack_1f60 = (fdb_kvs_handle *)0x10fab9;
        db_compact_during_doc_delete();
      }
      lVar20 = 0;
      _Var21._M_i = (__int_type_conflict)&pfStack_1f38;
      do {
        pfStack_1f60 = (fdb_kvs_handle *)0x10fada;
        fdb_del(pfStack_1f40,apfStack_1ad8[lVar20]);
        if (lVar20 == 0x32) {
          pfStack_1f60 = (fdb_kvs_handle *)0x10faf2;
          pthread_create((pthread_t *)_Var21._M_i,(pthread_attr_t *)0x0,db_compact_during_doc_delete
                         ,pfStack_1f48);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 100);
      pfStack_1f60 = (fdb_kvs_handle *)0x10fb0a;
      pthread_join((pthread_t)pfStack_1f38,&pvStack_1f30);
      pfStack_1f60 = (fdb_kvs_handle *)0x10fb19;
      fdb_commit((fdb_file_handle *)pfStack_1f48,'\x01');
      pfStack_1f60 = (fdb_kvs_handle *)0x10fb2b;
      fdb_get_kvs_info(pfStack_1f40,(fdb_kvs_info *)auStack_1f10);
      if ((filemgr *)auStack_1f10._16_8_ != (filemgr *)0x0) {
        pfStack_1f60 = (fdb_kvs_handle *)0x10fb3a;
        db_compact_during_doc_delete();
      }
      pfStack_1f60 = (fdb_kvs_handle *)0x10fb44;
      fdb_kvs_close(pfStack_1f40);
      pfVar13 = (fdb_kvs_handle *)&pfStack_1f48;
      pfStack_1f60 = (fdb_kvs_handle *)0x10fb51;
      fdb_close((fdb_file_handle *)pfStack_1f48);
      pfStack_1f60 = (fdb_kvs_handle *)0x10fb68;
      ptr_fhandle = pfVar13;
      fVar3 = fdb_open((fdb_file_handle **)pfVar13,"./compact_test1",(fdb_config *)auStack_1ed0);
      handle = (fdb_kvs_handle *)0x64;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fc70;
      pfStack_1f60 = (fdb_kvs_handle *)0x10fb84;
      ptr_fhandle = pfStack_1f48;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_1f48,&pfStack_1f40,&fStack_1f28);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pfStack_1f60 = (fdb_kvs_handle *)0x10fb9e;
        fdb_get_kvs_info(pfStack_1f40,(fdb_kvs_info *)auStack_1f10);
        if ((filemgr *)auStack_1f10._16_8_ != (filemgr *)0x0) {
          pfStack_1f60 = (fdb_kvs_handle *)0x10fbad;
          db_compact_during_doc_delete();
        }
        lVar20 = 0;
        do {
          pfStack_1f60 = (fdb_kvs_handle *)0x10fbbc;
          fdb_doc_free(apfStack_1ad8[lVar20]);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 100);
        pfStack_1f60 = (fdb_kvs_handle *)0x10fbcf;
        fdb_kvs_close(pfStack_1f40);
        pfStack_1f60 = (fdb_kvs_handle *)0x10fbd9;
        fdb_close((fdb_file_handle *)pfStack_1f48);
        pfStack_1f60 = (fdb_kvs_handle *)0x10fbde;
        fdb_shutdown();
        pfStack_1f60 = (fdb_kvs_handle *)0x10fbe3;
        memleak_end();
        pcVar17 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar17 = "%s FAILED\n";
        }
        pfStack_1f60 = (fdb_kvs_handle *)0x10fc14;
        fprintf(_stderr,pcVar17,"multi thread client shutdown");
        return;
      }
    }
    else {
      pfStack_1f60 = (fdb_kvs_handle *)0x10fc6b;
      db_compact_during_doc_delete();
LAB_0010fc6b:
      pfStack_1f60 = (fdb_kvs_handle *)0x10fc70;
      db_compact_during_doc_delete();
LAB_0010fc70:
      pfStack_1f60 = (fdb_kvs_handle *)0x10fc75;
      db_compact_during_doc_delete();
    }
    pfStack_1f60 = (fdb_kvs_handle *)0x10fc7a;
    db_compact_during_doc_delete();
LAB_0010fc7a:
    pfStack_1f60 = (fdb_kvs_handle *)0x10fc7f;
    db_compact_during_doc_delete();
  }
  else {
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_1f48;
    pfStack_1f60 = (fdb_kvs_handle *)0x10fc41;
    fVar3 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_1ed0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fc7a;
    pfStack_1f60 = (fdb_kvs_handle *)0x10fc51;
    ptr_fhandle = pfStack_1f48;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_1f48,(char *)0x0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_1f60 = (fdb_kvs_handle *)0x10fc5f;
      fdb_close((fdb_file_handle *)pfStack_1f48);
      pfStack_1f60 = (fdb_kvs_handle *)0x10fc66;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_1f60 = (fdb_kvs_handle *)compaction_daemon_test;
  db_compact_during_doc_delete();
  pcVar12 = (char *)0x0;
  pfStack_15d18 = (fdb_kvs_handle *)0x10fcab;
  pfStack_15cd0 = ptr_fhandle;
  pfStack_1f88 = pfVar11;
  pfStack_1f80 = handle;
  pfStack_1f78 = doc;
  pfStack_1f70 = pfVar13;
  ppfStack_1f68 = (fdb_doc **)_Var21._M_i;
  pfStack_1f60 = pfVar8;
  gettimeofday(&tStack_15b68,(__timezone_ptr_t)0x0);
  pfStack_15d18 = (fdb_kvs_handle *)0x10fcb0;
  memleak_start();
  pfStack_15d18 = (fdb_kvs_handle *)0x10fcbc;
  system("rm -rf  compact_test* > errorlog.txt");
  pfVar11 = (fdb_kvs_handle *)auStack_15c70;
  pfStack_15d18 = (fdb_kvs_handle *)0x10fccc;
  fdb_get_default_config();
  pfStack_15d18 = (fdb_kvs_handle *)0x10fcd6;
  fdb_get_default_kvs_config();
  auStack_15c70._8_8_ = (kvs_ops_stat *)0x0;
  auStack_15c70._16_8_ = (fdb_file_handle *)0x400;
  auStack_15c70._36_4_ = 1;
  auStack_15c70._46_2_ = 0x1e01;
  auStack_15c70._56_8_ = (docio_handle *)0x1;
  auStack_15c70._120_8_ = 0;
  pcVar17 = auStack_15d00;
  pfStack_15d18 = (fdb_kvs_handle *)0x10fd11;
  fVar3 = fdb_open((fdb_file_handle **)pcVar17,"compact_test",(fdb_config *)pfVar11);
  if (fVar3 == FDB_RESULT_INVALID_CONFIG) {
    auStack_15c70._120_8_ = 4;
    pfStack_15d18 = (fdb_kvs_handle *)0x10fd3e;
    fdb_open((fdb_file_handle **)auStack_15d00,"compact_test",(fdb_config *)auStack_15c70);
    pfVar11 = (fdb_kvs_handle *)(auStack_15d00 + 8);
    pfStack_15d18 = (fdb_kvs_handle *)0x10fd53;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_15d00._0_8_,(fdb_kvs_handle **)pfVar11,&fStack_15cc8);
    pfStack_15d18 = (fdb_kvs_handle *)0x10fd69;
    pcVar17 = (char *)auStack_15d00._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_15d00._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110810;
    pfStack_15d18 = (fdb_kvs_handle *)0x10fd7d;
    puts("Initialize..");
    pcVar12 = (char *)0x0;
    uVar16 = 0;
    do {
      pfStack_15d18 = (fdb_kvs_handle *)0x10fd9e;
      sprintf((char *)apfStack_15b10,"key%04d",uVar16 & 0xffffffff);
      pfStack_15d18 = (fdb_kvs_handle *)0x10fdba;
      sprintf(acStack_15a10,"meta%04d",uVar16 & 0xffffffff);
      pfStack_15d18 = (fdb_kvs_handle *)0x10fdd6;
      sprintf(acStack_15910,"body%04d",uVar16 & 0xffffffff);
      pfVar8 = (fdb_kvs_handle *)(&afStack_15810[0].kvs_config.create_if_missing + (long)pcVar12);
      pfStack_15d18 = (fdb_kvs_handle *)0x10fde9;
      sVar5 = strlen((char *)apfStack_15b10);
      _Var21._M_i = sVar5 + 1;
      pfStack_15d18 = (fdb_kvs_handle *)0x10fdf5;
      sVar5 = strlen(acStack_15a10);
      doc = (fdb_kvs_handle *)(sVar5 + 1);
      pfStack_15d18 = (fdb_kvs_handle *)0x10fe01;
      sVar5 = strlen(acStack_15910);
      pfStack_15d18 = (fdb_kvs_handle *)0x10fe29;
      fdb_doc_create((fdb_doc **)pfVar8,apfStack_15b10,_Var21._M_i,acStack_15a10,(size_t)doc,
                     acStack_15910,sVar5 + 1);
      pfStack_15d18 = (fdb_kvs_handle *)0x10fe3b;
      fdb_set((fdb_kvs_handle *)auStack_15d00._8_8_,
              *(fdb_doc **)(&afStack_15810[0].kvs_config.create_if_missing + uVar16 * 8));
      uVar16 = uVar16 + 1;
      pcVar12 = (char *)((long)pcVar12 + 8);
    } while (uVar16 != 10000);
    pfVar11 = (fdb_kvs_handle *)auStack_15d00;
    pfStack_15d18 = (fdb_kvs_handle *)0x10fe5e;
    fdb_commit((fdb_file_handle *)auStack_15d00._0_8_,'\0');
    pfStack_15d18 = (fdb_kvs_handle *)0x10fe66;
    fdb_close((fdb_file_handle *)auStack_15d00._0_8_);
    pfStack_15d18 = (fdb_kvs_handle *)0x10fe7d;
    pcVar17 = (char *)pfVar11;
    fVar3 = fdb_open((fdb_file_handle **)pfVar11,"compact_test",(fdb_config *)auStack_15c70);
    handle = (fdb_kvs_handle *)0x2710;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110815;
    pfStack_15d18 = (fdb_kvs_handle *)0x10fe99;
    pcVar17 = (char *)auStack_15d00._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_15d00._0_8_,(fdb_kvs_handle **)(auStack_15d00 + 8)
                       ,&fStack_15cc8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011081a;
    pfStack_15d18 = (fdb_kvs_handle *)0x10feb9;
    pcVar17 = (char *)auStack_15d00._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_15d00._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011081f;
    pfVar11 = (fdb_kvs_handle *)&_Stack_15b58;
    pfStack_15d18 = (fdb_kvs_handle *)0x10fed6;
    fdb_get_file_info((fdb_file_handle *)auStack_15d00._0_8_,(fdb_file_info *)pfVar11);
    pfStack_15d18 = (fdb_kvs_handle *)0x10fee5;
    iVar4 = strcmp((char *)_Stack_15b58._M_i,"compact_test");
    if (iVar4 != 0) {
      pfStack_15d18 = (fdb_kvs_handle *)0x10fef6;
      compaction_daemon_test();
    }
    pcVar12 = "key%04d";
    _Var21._M_i = (__int_type_conflict)apfStack_15b10;
    doc = (fdb_kvs_handle *)0x0;
    pfVar13 = pfVar8;
    do {
      pfStack_15d18 = (fdb_kvs_handle *)0x10ff18;
      sprintf((char *)_Var21._M_i,"key%04d",(ulong)doc & 0xffffffff);
      pfStack_15d18 = (fdb_kvs_handle *)0x10ff20;
      sVar5 = strlen((char *)_Var21._M_i);
      pfStack_15d18 = (fdb_kvs_handle *)0x10ff41;
      fdb_doc_create((fdb_doc **)&pfStack_15ce8,(void *)_Var21._M_i,sVar5 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_15d18 = (fdb_kvs_handle *)0x10ff50;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_15d00._8_8_,(fdb_doc *)pfStack_15ce8);
      pfVar8 = pfStack_15ce8;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_001107e6:
        pfStack_15d18 = (fdb_kvs_handle *)0x1107eb;
        compaction_daemon_test();
        goto LAB_001107eb;
      }
      pfVar11 = (fdb_kvs_handle *)(pfStack_15ce8->field_6).seqtree;
      handle = *(fdb_kvs_handle **)
                (*(long *)(&afStack_15810[0].kvs_config.create_if_missing + (long)doc * 8) + 0x40);
      pfStack_15d18 = (fdb_kvs_handle *)0x10ff7c;
      iVar4 = bcmp(pfVar11,handle,(size_t)(pfStack_15ce8->kvs_config).custom_cmp_param);
      pfVar13 = pfVar8;
      if (iVar4 != 0) {
        pfStack_15d18 = (fdb_kvs_handle *)0x1107e6;
        compaction_daemon_test();
        goto LAB_001107e6;
      }
      pfStack_15d18 = (fdb_kvs_handle *)0x10ff8c;
      fdb_doc_free((fdb_doc *)pfVar8);
      doc = (fdb_kvs_handle *)&(doc->kvs_config).field_0x1;
    } while (doc != (fdb_kvs_handle *)0x2710);
    pfStack_15d18 = (fdb_kvs_handle *)0x10ffb0;
    pcVar17 = (char *)auStack_15d00._8_8_;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_15d00._8_8_,
                              (fdb_kvs_handle **)&pfStack_15ca8,10000);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110824;
    pfStack_15d18 = (fdb_kvs_handle *)0x10ffc2;
    fdb_kvs_close((fdb_kvs_handle *)pfStack_15ca8);
    pfVar11 = (fdb_kvs_handle *)auStack_15d00;
    pfStack_15d18 = (fdb_kvs_handle *)0x10ffcf;
    fdb_close((fdb_file_handle *)auStack_15d00._0_8_);
    pfStack_15d18 = (fdb_kvs_handle *)0x10ffdb;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_15d18 = (fdb_kvs_handle *)0x10fff2;
    pcVar17 = (char *)pfVar11;
    fVar3 = fdb_open((fdb_file_handle **)pfVar11,"compact_test",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110829;
    pfStack_15d18 = (fdb_kvs_handle *)0x11000e;
    pcVar17 = (char *)auStack_15d00._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_15d00._0_8_,(fdb_kvs_handle **)(auStack_15d00 + 8)
                       ,&fStack_15cc8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011082e;
    pfStack_15d18 = (fdb_kvs_handle *)0x11002e;
    pcVar17 = (char *)auStack_15d00._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_15d00._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110833;
    pcVar12 = "key%04d";
    _Var21._M_i = (__int_type_conflict)apfStack_15b10;
    doc = (fdb_kvs_handle *)0x0;
    do {
      pfStack_15d18 = (fdb_kvs_handle *)0x110058;
      sprintf((char *)_Var21._M_i,"key%04d",(ulong)doc & 0xffffffff);
      pfStack_15d18 = (fdb_kvs_handle *)0x110060;
      sVar5 = strlen((char *)_Var21._M_i);
      pfStack_15d18 = (fdb_kvs_handle *)0x110081;
      fdb_doc_create((fdb_doc **)&pfStack_15ce8,(void *)_Var21._M_i,sVar5 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_15d18 = (fdb_kvs_handle *)0x110090;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_15d00._8_8_,(fdb_doc *)pfStack_15ce8);
      pfVar13 = pfStack_15ce8;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001107f6;
      pfVar11 = (fdb_kvs_handle *)(pfStack_15ce8->field_6).seqtree;
      handle = *(fdb_kvs_handle **)
                (*(long *)(&afStack_15810[0].kvs_config.create_if_missing + (long)doc * 8) + 0x40);
      pfStack_15d18 = (fdb_kvs_handle *)0x1100bc;
      iVar4 = bcmp(pfVar11,handle,(size_t)(pfStack_15ce8->kvs_config).custom_cmp_param);
      if (iVar4 != 0) goto LAB_001107eb;
      pfStack_15d18 = (fdb_kvs_handle *)0x1100cc;
      fdb_doc_free((fdb_doc *)pfVar13);
      doc = (fdb_kvs_handle *)&(doc->kvs_config).field_0x1;
      pfVar8 = pfVar13;
    } while (doc != (fdb_kvs_handle *)0x2710);
    pfVar11 = (fdb_kvs_handle *)auStack_15d00;
    pfStack_15d18 = (fdb_kvs_handle *)0x1100e9;
    fdb_close((fdb_file_handle *)auStack_15d00._0_8_);
    pfStack_15d18 = (fdb_kvs_handle *)0x1100f5;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_15d18 = (fdb_kvs_handle *)0x11010c;
    pcVar17 = (char *)pfVar11;
    fVar3 = fdb_open((fdb_file_handle **)pfVar11,"compact_test",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110838;
    pfStack_15d18 = (fdb_kvs_handle *)0x110128;
    pcVar17 = (char *)auStack_15d00._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_15d00._0_8_,(fdb_kvs_handle **)(auStack_15d00 + 8)
                       ,&fStack_15cc8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011083d;
    pfStack_15d18 = (fdb_kvs_handle *)0x110148;
    pcVar17 = (char *)auStack_15d00._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_15d00._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110842;
    pcVar12 = "key%04d";
    _Var21._M_i = (__int_type_conflict)apfStack_15b10;
    doc = (fdb_kvs_handle *)0x0;
    do {
      pfStack_15d18 = (fdb_kvs_handle *)0x110172;
      sprintf((char *)_Var21._M_i,"key%04d",(ulong)doc & 0xffffffff);
      pfStack_15d18 = (fdb_kvs_handle *)0x11017a;
      sVar5 = strlen((char *)_Var21._M_i);
      pfStack_15d18 = (fdb_kvs_handle *)0x11019b;
      fdb_doc_create((fdb_doc **)&pfStack_15ce8,(void *)_Var21._M_i,sVar5 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_15d18 = (fdb_kvs_handle *)0x1101aa;
      pcVar17 = (char *)auStack_15d00._8_8_;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_15d00._8_8_,(fdb_doc *)pfStack_15ce8);
      pfVar13 = pfStack_15ce8;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110806;
      pfVar11 = (fdb_kvs_handle *)(pfStack_15ce8->field_6).seqtree;
      handle = *(fdb_kvs_handle **)
                (*(long *)(&afStack_15810[0].kvs_config.create_if_missing + (long)doc * 8) + 0x40);
      pfStack_15d18 = (fdb_kvs_handle *)0x1101d6;
      iVar4 = bcmp(pfVar11,handle,(size_t)(pfStack_15ce8->kvs_config).custom_cmp_param);
      if (iVar4 != 0) goto LAB_001107fb;
      pfStack_15d18 = (fdb_kvs_handle *)0x1101e6;
      fdb_doc_free((fdb_doc *)pfVar13);
      doc = (fdb_kvs_handle *)&(doc->kvs_config).field_0x1;
      pfVar8 = pfVar13;
    } while (doc != (fdb_kvs_handle *)0x2710);
    pfStack_15d18 = (fdb_kvs_handle *)0x110200;
    fdb_close((fdb_file_handle *)auStack_15d00._0_8_);
    pcVar17 = (char *)&pfStack_15cd8;
    pfStack_15d18 = (fdb_kvs_handle *)0x110219;
    fVar3 = fdb_open((fdb_file_handle **)pcVar17,"compact_test_less",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110847;
    pfStack_15d18 = (fdb_kvs_handle *)0x110238;
    pcVar17 = (char *)pfStack_15cd8;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_15cd8,(fdb_kvs_handle **)&pfStack_15c90,
                       &fStack_15cc8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011084c;
    auStack_15c70._46_2_ = auStack_15c70._46_2_ & 0xff;
    pcVar17 = (char *)&pfStack_15ce0;
    pfStack_15d18 = (fdb_kvs_handle *)0x11025d;
    fVar3 = fdb_open((fdb_file_handle **)pcVar17,"compact_test_non",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110851;
    pfStack_15d18 = (fdb_kvs_handle *)0x110279;
    pcVar17 = (char *)pfStack_15ce0;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_15ce0,(fdb_kvs_handle **)&aStack_15c98.seqtree,
                       &fStack_15cc8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110856;
    auStack_15c70._46_2_ = auStack_15c70._46_2_ & 0xff00;
    pcVar17 = (char *)&pfStack_15cf0;
    pfStack_15d18 = (fdb_kvs_handle *)0x11029e;
    fVar3 = fdb_open((fdb_file_handle **)pcVar17,"compact_test_manual",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011085b;
    pfStack_15d18 = (fdb_kvs_handle *)0x1102ba;
    pcVar17 = (char *)pfStack_15cf0;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_15cf0,(fdb_kvs_handle **)&aStack_15ca0.seqtree,
                       &fStack_15cc8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110860;
    auStack_15c70._46_2_ = 0x1e01;
    pcVar17 = auStack_15d00;
    pfStack_15d18 = (fdb_kvs_handle *)0x1102e1;
    fVar3 = fdb_open((fdb_file_handle **)pcVar17,"compact_test",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110865;
    pfStack_15d18 = (fdb_kvs_handle *)0x1102fd;
    pcVar17 = (char *)auStack_15d00._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_15d00._0_8_,(fdb_kvs_handle **)(auStack_15d00 + 8)
                       ,&fStack_15cc8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011086a;
    pfStack_15d18 = (fdb_kvs_handle *)0x11031d;
    pcVar17 = (char *)auStack_15d00._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_15d00._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011086f;
    pcVar12 = (char *)0x0;
    pfStack_15d18 = (fdb_kvs_handle *)0x11033a;
    printf("wait for %d seconds..\n");
    pfStack_15d18 = (fdb_kvs_handle *)0x11034c;
    gettimeofday((timeval *)(auStack_15c70 + 0xf8),(__timezone_ptr_t)0x0);
    tVar23.tv_usec = _Stack_15b70._M_i;
    tVar23.tv_sec = auStack_15c70._248_8_;
    do {
      pfVar13 = (fdb_kvs_handle *)0xfffffffffffec780;
      doc = (fdb_kvs_handle *)0x0;
      iVar4 = 0;
      aStack_15cb0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar12;
      do {
        pfStack_15d18 = (fdb_kvs_handle *)0x110388;
        fdb_set((fdb_kvs_handle *)auStack_15d00._8_8_,*(fdb_doc **)(acStack_1f90 + (long)pfVar13));
        pfStack_15d18 = (fdb_kvs_handle *)0x110394;
        fdb_commit((fdb_file_handle *)auStack_15d00._0_8_,'\0');
        uVar14 = (int)((ulong)doc / 100) * 100 + iVar4;
        handle = (fdb_kvs_handle *)(ulong)uVar14;
        if (uVar14 == 0) {
          pfStack_15d18 = (fdb_kvs_handle *)0x1103ae;
          fdb_set((fdb_kvs_handle *)pfStack_15c90,*(fdb_doc **)(acStack_1f90 + (long)pfVar13));
          pfStack_15d18 = (fdb_kvs_handle *)0x1103ba;
          fdb_commit((fdb_file_handle *)pfStack_15cd8,'\0');
        }
        pfStack_15d18 = (fdb_kvs_handle *)0x1103cc;
        fdb_set((fdb_kvs_handle *)aStack_15c98.seqtree,*(fdb_doc **)(acStack_1f90 + (long)pfVar13));
        pfStack_15d18 = (fdb_kvs_handle *)0x1103d8;
        fdb_commit((fdb_file_handle *)pfStack_15ce0,'\0');
        pfStack_15d18 = (fdb_kvs_handle *)0x1103ea;
        fdb_set((fdb_kvs_handle *)aStack_15ca0.seqtree,*(fdb_doc **)(acStack_1f90 + (long)pfVar13));
        pfStack_15d18 = (fdb_kvs_handle *)0x1103f6;
        fdb_commit((fdb_file_handle *)pfStack_15cf0,'\0');
        pfStack_15d18 = (fdb_kvs_handle *)0x110405;
        gettimeofday((timeval *)&tStack_15c80,(__timezone_ptr_t)0x0);
        pfStack_15d18 = (fdb_kvs_handle *)0x110420;
        tVar22 = _utime_gap(tVar23,tStack_15c80);
        if (pfStack_15cd0 <= (fdb_kvs_handle *)tVar22.tv_sec) {
          pcVar12 = (char *)(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
          break;
        }
        iVar4 = iVar4 + -1;
        doc = (fdb_kvs_handle *)(ulong)((int)doc + 1);
        pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).custom_cmp;
        pcVar12 = (char *)aStack_15cb0;
      } while (pfVar13 != (fdb_kvs_handle *)0x0);
    } while ((int)pcVar12 == 0);
    pfStack_15d18 = (fdb_kvs_handle *)0x110459;
    pcVar17 = (char *)auStack_15d00._0_8_;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_15d00._0_8_,0x3c);
    pfVar11 = (fdb_kvs_handle *)auStack_15c70._248_8_;
    _Var21._M_i = _Stack_15b70._M_i;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110874;
    pfStack_15d18 = (fdb_kvs_handle *)0x110470;
    pcVar17 = (char *)auStack_15d00._0_8_;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_15d00._0_8_,1);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110879;
    pfStack_15d18 = (fdb_kvs_handle *)0x110484;
    pcVar17 = (char *)pfStack_15ce0;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_15ce0,(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011087e;
    pfStack_15d18 = (fdb_kvs_handle *)0x11049d;
    pcVar17 = (char *)pfStack_15cf0;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_15cf0,"compact_test_manual_compacted");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110883;
    auStack_15c70._46_2_ = auStack_15c70._46_2_ & 0xff00;
    pcVar17 = (char *)&pfStack_15c88;
    pfStack_15d18 = (fdb_kvs_handle *)0x1104c5;
    fVar3 = fdb_open((fdb_file_handle **)pcVar17,"compact_test_manual_compacted",
                     (fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110888;
    pfStack_15d18 = (fdb_kvs_handle *)0x1104e1;
    pcVar17 = (char *)pfStack_15cf0;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_15cf0,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011088d;
    pfStack_15d18 = (fdb_kvs_handle *)0x1104f7;
    fVar3 = fdb_close((fdb_file_handle *)pfStack_15c88);
    pcVar17 = (char *)pfStack_15c88;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110892;
    pfStack_15d18 = (fdb_kvs_handle *)0x110513;
    pcVar17 = (char *)pfStack_15cf0;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_15cf0,'\x01',10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110897;
    pfStack_15d18 = (fdb_kvs_handle *)0x11052f;
    pcVar17 = (char *)pfStack_15cf0;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_15cf0,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011089c;
    pfStack_15d18 = (fdb_kvs_handle *)0x110541;
    pcVar17 = (char *)pfStack_15cf0;
    fVar3 = fdb_close((fdb_file_handle *)pfStack_15cf0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108a1;
    auStack_15c70[0x2e] = 1;
    pcVar17 = (char *)&pfStack_15cf0;
    pfStack_15d18 = (fdb_kvs_handle *)0x110566;
    fVar3 = fdb_open((fdb_file_handle **)pcVar17,"compact_test_manual_compacted",
                     (fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108a6;
    pfStack_15d18 = (fdb_kvs_handle *)0x11057c;
    pcVar17 = (char *)pfStack_15ce0;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_15ce0,'\0',0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ab;
    pfStack_15d18 = (fdb_kvs_handle *)0x11058e;
    pcVar17 = (char *)pfStack_15ce0;
    fVar3 = fdb_close((fdb_file_handle *)pfStack_15ce0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108b0;
    auStack_15c70._46_2_ = auStack_15c70._46_2_ & 0xff00;
    pcVar17 = (char *)&pfStack_15ce0;
    pfStack_15d18 = (fdb_kvs_handle *)0x1105b3;
    fVar3 = fdb_open((fdb_file_handle **)pcVar17,"compact_test_non",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108b5;
    pcVar12 = "compact_test_non.manual";
    pfStack_15d18 = (fdb_kvs_handle *)0x1105cf;
    fdb_compact((fdb_file_handle *)pfStack_15ce0,"compact_test_non.manual");
    pfVar11 = (fdb_kvs_handle *)auStack_15d00;
    pfStack_15d18 = (fdb_kvs_handle *)0x1105dc;
    fdb_close((fdb_file_handle *)auStack_15d00._0_8_);
    pfStack_15d18 = (fdb_kvs_handle *)0x1105e6;
    fdb_close((fdb_file_handle *)pfStack_15cd8);
    pfStack_15d18 = (fdb_kvs_handle *)0x1105f0;
    fdb_close((fdb_file_handle *)pfStack_15cf0);
    auStack_15c70[0x2e] = 1;
    pfStack_15d18 = (fdb_kvs_handle *)0x110607;
    pcVar17 = (char *)pfVar11;
    fVar3 = fdb_open((fdb_file_handle **)pfVar11,"compact_test_non.manual",
                     (fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108ba;
    pcVar17 = "compact_test_non.manual";
    pfStack_15d18 = (fdb_kvs_handle *)0x110624;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108bf;
    auStack_15c70._46_2_ = auStack_15c70._46_2_ & 0xff00;
    pcVar17 = auStack_15d00;
    pfStack_15d18 = (fdb_kvs_handle *)0x11064a;
    fVar3 = fdb_open((fdb_file_handle **)pcVar17,"compact_test_manual_compacted",
                     (fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c4;
    pcVar17 = "compact_test_manual_compacted";
    pfStack_15d18 = (fdb_kvs_handle *)0x110667;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c9;
    auStack_15c70[0x2e] = 1;
    pcVar17 = "compact_test_manual_compacted";
    pfStack_15d18 = (fdb_kvs_handle *)0x110688;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
    auStack_15c70._46_2_ = auStack_15c70._46_2_ & 0xff00;
    pcVar17 = "compact_test_non.manual";
    pfStack_15d18 = (fdb_kvs_handle *)0x1106a8;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_001108d3;
    pfStack_15d18 = (fdb_kvs_handle *)0x1106bb;
    fdb_close((fdb_file_handle *)pfStack_15ce0);
    pfStack_15d18 = (fdb_kvs_handle *)0x1106c0;
    fVar3 = fdb_shutdown();
    pcVar17 = (char *)pfStack_15ce0;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
    pcVar17 = "compact_test_non.manual";
    pfStack_15d18 = (fdb_kvs_handle *)0x1106dc;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
    auStack_15c70._36_4_ = 2;
    pcVar17 = auStack_15d00;
    pfStack_15d18 = (fdb_kvs_handle *)0x110704;
    fVar3 = fdb_open((fdb_file_handle **)pcVar17,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e2;
    pcVar17 = auStack_15d00;
    pfStack_15d18 = (fdb_kvs_handle *)0x110726;
    fVar3 = fdb_open((fdb_file_handle **)pcVar17,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e7;
    pcVar17 = auStack_15d00;
    pfStack_15d18 = (fdb_kvs_handle *)0x110748;
    fVar3 = fdb_open((fdb_file_handle **)pcVar17,"compact_test_non",(fdb_config *)auStack_15c70);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108ec;
    pcVar17 = auStack_15d00;
    pfStack_15d18 = (fdb_kvs_handle *)0x11076a;
    fVar3 = fdb_open((fdb_file_handle **)pcVar17,"compact_test_non.manual",
                     (fdb_config *)auStack_15c70);
    if (fVar3 == FDB_RESULT_NO_SUCH_FILE) {
      lVar20 = 0;
      do {
        pfStack_15d18 = (fdb_kvs_handle *)0x110782;
        fdb_doc_free(*(fdb_doc **)(&afStack_15810[0].kvs_config.create_if_missing + lVar20 * 8));
        lVar20 = lVar20 + 1;
      } while (lVar20 != 10000);
      pfStack_15d18 = (fdb_kvs_handle *)0x110793;
      fdb_shutdown();
      pfStack_15d18 = (fdb_kvs_handle *)0x110798;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_15d18 = (fdb_kvs_handle *)0x1107c9;
      fprintf(_stderr,pcVar17,"compaction daemon test");
      return;
    }
  }
  else {
LAB_0011080b:
    pfStack_15d18 = (fdb_kvs_handle *)0x110810;
    compaction_daemon_test();
LAB_00110810:
    pfStack_15d18 = (fdb_kvs_handle *)0x110815;
    compaction_daemon_test();
LAB_00110815:
    pfStack_15d18 = (fdb_kvs_handle *)0x11081a;
    compaction_daemon_test();
LAB_0011081a:
    pfStack_15d18 = (fdb_kvs_handle *)0x11081f;
    compaction_daemon_test();
LAB_0011081f:
    pfStack_15d18 = (fdb_kvs_handle *)0x110824;
    compaction_daemon_test();
LAB_00110824:
    pfStack_15d18 = (fdb_kvs_handle *)0x110829;
    compaction_daemon_test();
LAB_00110829:
    pfStack_15d18 = (fdb_kvs_handle *)0x11082e;
    compaction_daemon_test();
LAB_0011082e:
    pfStack_15d18 = (fdb_kvs_handle *)0x110833;
    compaction_daemon_test();
    pfVar13 = pfVar8;
LAB_00110833:
    pfStack_15d18 = (fdb_kvs_handle *)0x110838;
    compaction_daemon_test();
LAB_00110838:
    pfStack_15d18 = (fdb_kvs_handle *)0x11083d;
    compaction_daemon_test();
LAB_0011083d:
    pfStack_15d18 = (fdb_kvs_handle *)0x110842;
    compaction_daemon_test();
LAB_00110842:
    pfStack_15d18 = (fdb_kvs_handle *)0x110847;
    compaction_daemon_test();
LAB_00110847:
    pfStack_15d18 = (fdb_kvs_handle *)0x11084c;
    compaction_daemon_test();
LAB_0011084c:
    pfStack_15d18 = (fdb_kvs_handle *)0x110851;
    compaction_daemon_test();
LAB_00110851:
    pfStack_15d18 = (fdb_kvs_handle *)0x110856;
    compaction_daemon_test();
LAB_00110856:
    pfStack_15d18 = (fdb_kvs_handle *)0x11085b;
    compaction_daemon_test();
LAB_0011085b:
    pfStack_15d18 = (fdb_kvs_handle *)0x110860;
    compaction_daemon_test();
LAB_00110860:
    pfStack_15d18 = (fdb_kvs_handle *)0x110865;
    compaction_daemon_test();
LAB_00110865:
    pfStack_15d18 = (fdb_kvs_handle *)0x11086a;
    compaction_daemon_test();
LAB_0011086a:
    pfStack_15d18 = (fdb_kvs_handle *)0x11086f;
    compaction_daemon_test();
LAB_0011086f:
    pfStack_15d18 = (fdb_kvs_handle *)0x110874;
    compaction_daemon_test();
LAB_00110874:
    pfStack_15d18 = (fdb_kvs_handle *)0x110879;
    compaction_daemon_test();
LAB_00110879:
    pfStack_15d18 = (fdb_kvs_handle *)0x11087e;
    compaction_daemon_test();
LAB_0011087e:
    pfStack_15d18 = (fdb_kvs_handle *)0x110883;
    compaction_daemon_test();
LAB_00110883:
    pfStack_15d18 = (fdb_kvs_handle *)0x110888;
    compaction_daemon_test();
LAB_00110888:
    pfStack_15d18 = (fdb_kvs_handle *)0x11088d;
    compaction_daemon_test();
LAB_0011088d:
    pfStack_15d18 = (fdb_kvs_handle *)0x110892;
    compaction_daemon_test();
LAB_00110892:
    pfStack_15d18 = (fdb_kvs_handle *)0x110897;
    compaction_daemon_test();
LAB_00110897:
    pfStack_15d18 = (fdb_kvs_handle *)0x11089c;
    compaction_daemon_test();
LAB_0011089c:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108a1;
    compaction_daemon_test();
LAB_001108a1:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108a6;
    compaction_daemon_test();
LAB_001108a6:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108ab;
    compaction_daemon_test();
LAB_001108ab:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108b0;
    compaction_daemon_test();
LAB_001108b0:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108b5;
    compaction_daemon_test();
LAB_001108b5:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108ba;
    compaction_daemon_test();
LAB_001108ba:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108bf;
    compaction_daemon_test();
LAB_001108bf:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108c4;
    compaction_daemon_test();
LAB_001108c4:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108c9;
    compaction_daemon_test();
LAB_001108c9:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108ce;
    compaction_daemon_test();
LAB_001108ce:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108d3;
    compaction_daemon_test();
LAB_001108d3:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108d8;
    compaction_daemon_test();
LAB_001108d8:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108dd;
    compaction_daemon_test();
LAB_001108dd:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108e2;
    compaction_daemon_test();
LAB_001108e2:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108e7;
    compaction_daemon_test();
LAB_001108e7:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108ec;
    compaction_daemon_test();
LAB_001108ec:
    pfStack_15d18 = (fdb_kvs_handle *)0x1108f1;
    compaction_daemon_test();
  }
  pfStack_15d18 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_15eb0 = (fdb_kvs_handle *)0x110916;
  aStack_15d40 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar12;
  pfStack_15d38 = handle;
  pfStack_15d30 = doc;
  pfStack_15d28 = pfVar11;
  ppfStack_15d20 = (fdb_doc **)_Var21._M_i;
  pfStack_15d18 = pfVar13;
  gettimeofday(&tStack_15e60,(__timezone_ptr_t)0x0);
  pfStack_15eb0 = (fdb_kvs_handle *)0x11091b;
  memleak_start();
  pfStack_15eb0 = (fdb_kvs_handle *)0x110927;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_15eb0 = (fdb_kvs_handle *)0x110934;
  fdb_get_default_config();
  uStack_15e0a = 1;
  uStack_15e00._0_2_ = 1;
  uStack_15e00._2_2_ = 0;
  uStack_15e00._4_4_ = 0;
  pfStack_15eb0 = (fdb_kvs_handle *)0x110955;
  fVar3 = fdb_open(&pfStack_15ea0,"compact_test",(fdb_config *)(auStack_15e50 + 0x18));
  pfVar18 = (fdb_config *)(auStack_15e50 + 0x18);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfVar18 = (fdb_config *)auStack_15e50;
    pfStack_15eb0 = (fdb_kvs_handle *)0x11096a;
    fdb_get_default_kvs_config();
    pfStack_15eb0 = (fdb_kvs_handle *)0x11097c;
    fVar3 = fdb_kvs_open_default(pfStack_15ea0,&pfStack_15e98,(fdb_kvs_config *)pfVar18);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110aad;
    pfStack_15eb0 = (fdb_kvs_handle *)0x110993;
    gettimeofday(&tStack_15e70,(__timezone_ptr_t)0x0);
    pfStack_15eb0 = (fdb_kvs_handle *)0x1109a3;
    printf("wait for %d seconds..\n",(ulong)pcVar17 & 0xffffffff);
    tVar22.tv_usec = tStack_15e70.tv_usec;
    tVar22.tv_sec = tStack_15e70.tv_sec;
    doc = (fdb_kvs_handle *)((long)&atStack_15e90[1].tv_sec + 1);
    pfVar13 = (fdb_kvs_handle *)0x0;
    do {
      iVar4 = (int)pfVar13;
      pfStack_15eb0 = (fdb_kvs_handle *)0x1109c4;
      sprintf((char *)doc,"%d",pfVar13);
      handle = pfStack_15e98;
      pfStack_15eb0 = (fdb_kvs_handle *)0x1109d1;
      sVar5 = strlen((char *)doc);
      pfStack_15eb0 = (fdb_kvs_handle *)0x1109ec;
      fVar3 = fdb_set_kv(handle,doc,sVar5,"value",5);
      pfVar18 = (fdb_config *)tStack_15e70.tv_sec;
      _Var21._M_i = tStack_15e70.tv_usec;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110aa3:
        pfStack_15eb0 = (fdb_kvs_handle *)0x110aa8;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa8;
      }
      pfStack_15eb0 = (fdb_kvs_handle *)0x110a00;
      fVar3 = fdb_commit(pfStack_15ea0,'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_15eb0 = (fdb_kvs_handle *)0x110aa3;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa3;
      }
      pfStack_15eb0 = (fdb_kvs_handle *)0x110a14;
      gettimeofday((timeval *)atStack_15e90,(__timezone_ptr_t)0x0);
      pfStack_15eb0 = (fdb_kvs_handle *)0x110a29;
      tVar23 = _utime_gap(tVar22,atStack_15e90[0]);
    } while (((fdb_kvs_handle *)tVar23.tv_sec < pcVar17) &&
            (pfVar13 = (fdb_kvs_handle *)(ulong)(iVar4 + 1), iVar4 != 99999));
    pfStack_15eb0 = (fdb_kvs_handle *)0x110a49;
    fVar3 = fdb_close(pfStack_15ea0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ab2;
    pfStack_15eb0 = (fdb_kvs_handle *)0x110a52;
    fVar3 = fdb_shutdown();
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_15eb0 = (fdb_kvs_handle *)0x110a5b;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_15eb0 = (fdb_kvs_handle *)0x110a8c;
      fprintf(_stderr,pcVar17,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110aa8:
    pfStack_15eb0 = (fdb_kvs_handle *)0x110aad;
    auto_compaction_with_concurrent_insert_test();
LAB_00110aad:
    pfStack_15eb0 = (fdb_kvs_handle *)0x110ab2;
    auto_compaction_with_concurrent_insert_test();
LAB_00110ab2:
    pfStack_15eb0 = (fdb_kvs_handle *)0x110ab7;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_15eb0 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_15ed8 = (fdb_kvs_handle *)pcVar17;
  pfStack_15ed0 = handle;
  pfStack_15ec8 = doc;
  pfStack_15ec0 = pfVar18;
  ppfStack_15eb8 = (fdb_doc **)_Var21._M_i;
  pfStack_15eb0 = pfVar13;
  gettimeofday(&tStack_161e0,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_16250._32_8_ = (btree *)0x0;
  auStack_16250._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_15fd0.wal_threshold = 0x1000;
  fStack_15fd0.compaction_mode = '\x01';
  fStack_15fd0.compaction_threshold = '\n';
  fStack_15fd0.compactor_sleep_duration = 1;
  info_00 = (fdb_file_info *)0x14e0c5;
  pfVar8 = (fdb_kvs_handle *)&pfStack_16270;
  kvs_config_00 = (fdb_file_info *)0x1;
  fVar3 = fdb_open_custom_cmp((fdb_file_handle **)pfVar8,"compact_test",&fStack_15fd0,1,
                              (char **)(auStack_16250 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_16250 + 0x18),(void **)0x0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_16250._16_8_ = afStack_161d0[0].doc_count;
    auStack_16250._0_8_ = afStack_161d0[0].filename;
    auStack_16250._8_8_ = afStack_161d0[0].new_filename;
    info_00 = (fdb_file_info *)auStack_16268;
    pfVar8 = pfStack_16270;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_16270,(fdb_kvs_handle **)info_00,
                       (fdb_kvs_config *)auStack_16250);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110eb4;
    info_00 = (fdb_file_info *)auStack_16258;
    kvs_config_00 = (fdb_file_info *)auStack_16250;
    pfVar8 = pfStack_16270;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_16270,(fdb_kvs_handle **)info_00,"db",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110eb9;
    uVar16 = 0;
    do {
      sprintf((char *)afStack_161d0,"key%06d",uVar16);
      sprintf((char *)afStack_160d0,"body%06d",uVar16);
      pfVar8 = (fdb_kvs_handle *)auStack_16268._0_8_;
      sVar5 = strlen((char *)afStack_161d0);
      sVar6 = strlen((char *)afStack_160d0);
      kvs_config_00 = afStack_160d0;
      info_00 = afStack_161d0;
      fVar3 = fdb_set_kv(pfVar8,afStack_161d0,sVar5,afStack_160d0,sVar6);
      handle_00 = auStack_16258;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110e9b:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110ea0;
      }
      sVar5 = strlen((char *)afStack_161d0);
      sVar6 = strlen((char *)afStack_160d0);
      kvs_config_00 = afStack_160d0;
      info_00 = afStack_161d0;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)handle_00,afStack_161d0,sVar5,afStack_160d0,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar8 = (fdb_kvs_handle *)handle_00;
        goto LAB_00110e9b;
      }
      uVar14 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar14;
    } while (uVar14 != 10000);
    kvs_config_00 = (fdb_file_info *)auStack_16250;
    auStack_16250._8_8_ = _compact_test_keycmp;
    info_00 = (fdb_file_info *)(auStack_16268 + 8);
    pfVar8 = pfStack_16270;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_16270,(fdb_kvs_handle **)info_00,"db_custom",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ebe;
    info_00 = afStack_161d0;
    sprintf((char *)info_00,"key%06d",0);
    kvs_config_00 = afStack_160d0;
    sprintf((char *)kvs_config_00,"body%06d",0);
    sVar5 = strlen((char *)info_00);
    sVar6 = strlen((char *)kvs_config_00);
    fVar3 = fdb_set_kv((fdb_kvs_handle *)auStack_16268._8_8_,info_00,sVar5,kvs_config_00,sVar6);
    pfVar8 = (fdb_kvs_handle *)auStack_16268._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ec3;
    info_00 = (fdb_file_info *)0x0;
    pfVar8 = pfStack_16270;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_16270,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ec8;
    uVar16 = 0;
    uVar19 = 0;
    do {
      sprintf((char *)afStack_161d0,"key%06d",uVar19);
      sprintf((char *)afStack_160d0,"body%06d",uVar19);
      pfVar8 = (fdb_kvs_handle *)auStack_16268._0_8_;
      sVar5 = strlen((char *)afStack_161d0);
      sVar6 = strlen((char *)afStack_160d0);
      kvs_config_00 = afStack_160d0;
      info_00 = afStack_161d0;
      fVar3 = fdb_set_kv(pfVar8,afStack_161d0,sVar5,afStack_160d0,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ea5;
      info_00 = (fdb_file_info *)(auStack_16250 + 0x28);
      pfVar8 = pfStack_16270;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_16270,info_00);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ea0;
      if (uVar16 < uStack_16200) {
        uVar16 = uStack_16200;
      }
      uVar14 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar14;
    } while (uVar14 != 10000);
    info_00 = (fdb_file_info *)0x0;
    pfVar8 = pfStack_16270;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_16270,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ecd;
    info_00 = (fdb_file_info *)(auStack_16250 + 0x28);
    pfVar8 = pfStack_16270;
    fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_16270,info_00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ed2;
    if (uVar16 < uStack_16200) {
      uVar16 = uStack_16200;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar16);
    do {
      sleep(1);
      info_00 = (fdb_file_info *)(auStack_16250 + 0x28);
      pfVar8 = pfStack_16270;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_16270,
                                (fdb_file_info *)(auStack_16250 + 0x28));
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110eaa;
    } while (uVar16 <= uStack_16200);
    fVar3 = fdb_close((fdb_file_handle *)pfStack_16270);
    pfVar8 = pfStack_16270;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_shutdown();
      pfVar8 = pfStack_16270;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar17 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar17 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar17,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110edc;
    }
  }
  else {
LAB_00110eaf:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb4:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb9:
    auto_compaction_with_custom_cmp_function();
LAB_00110ebe:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec3:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec8:
    auto_compaction_with_custom_cmp_function();
LAB_00110ecd:
    auto_compaction_with_custom_cmp_function();
LAB_00110ed2:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110edc:
  auto_compaction_with_custom_cmp_function();
  if (info_00 == kvs_config_00) {
    memcmp(pfVar8,__s2,(size_t)info_00);
    return;
  }
  if (info_00 < kvs_config_00) {
    kvs_config_00 = info_00;
  }
  memcmp(pfVar8,__s2,(size_t)kvs_config_00);
  return;
LAB_0010eacf:
  pfStack_590 = (fdb_kvs_handle *)0x10ead4;
  compact_upto_test();
LAB_0010ead4:
  pfStack_590 = (fdb_kvs_handle *)0x10ead9;
  compact_upto_test();
LAB_0010ead9:
  pfStack_590 = (fdb_kvs_handle *)0x10eade;
  compact_upto_test();
LAB_0010eade:
  pfStack_590 = (fdb_kvs_handle *)0x10eae3;
  compact_upto_test();
LAB_0010eae3:
  pfStack_590 = (fdb_kvs_handle *)0x10eae8;
  compact_upto_test();
  goto LAB_0010eae8;
LAB_001107eb:
  pfStack_15d18 = (fdb_kvs_handle *)0x1107f6;
  compaction_daemon_test();
  pfVar8 = pfVar13;
LAB_001107f6:
  pfVar13 = pfVar8;
  pfStack_15d18 = (fdb_kvs_handle *)0x1107fb;
  compaction_daemon_test();
LAB_001107fb:
  pfStack_15d18 = (fdb_kvs_handle *)0x110806;
  pcVar17 = (char *)handle;
  compaction_daemon_test();
  pfVar8 = pfVar13;
LAB_00110806:
  _Var21._M_i = (__int_type_conflict)apfStack_15b10;
  pcVar12 = "key%04d";
  pfStack_15d18 = (fdb_kvs_handle *)0x11080b;
  compaction_daemon_test();
  goto LAB_0011080b;
LAB_00110ea0:
  auto_compaction_with_custom_cmp_function();
LAB_00110ea5:
  auto_compaction_with_custom_cmp_function();
LAB_00110eaa:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110eaf;
}

Assistant:

void compact_upto_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;
    fdb_snapshot_info_t *markers;
    fdb_kvs_handle *snapshot;
    uint64_t num_markers;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];
    char compact_filename[32];

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    // since this test requires static number of markers,
    // disable block reusing
    fconfig.block_reusing_threshold = 0;

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "compact_upto_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    if (!multi_kv) {
        TEST_CHK(num_markers == 4);
        for (r = 0; (uint64_t)r < num_markers; ++r) {
            TEST_CHK(markers[r].num_kvs_markers == 1);
            TEST_CHK(markers[r].kvs_markers[0].seqnum ==
                     (fdb_seqnum_t)(n - r*5));
        }
        r = 1; // Test compacting upto sequence number 15
        sprintf(compact_filename, "compact_test_compact%d", r);
        status = fdb_compact_upto(dbfile, compact_filename,
                                  markers[r].marker);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // create a snapshot
        status = fdb_snapshot_open(db[0], &snapshot,
                                   markers[r].kvs_markers[0].seqnum);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // close snapshot
        fdb_kvs_close(snapshot);
    } else {
        TEST_CHK(num_markers == 8);
        for (r = 0; r < num_kvs; ++r) {
            TEST_CHK(markers[r].num_kvs_markers == num_kvs+1);
            for (i = 0; i < num_kvs; ++i) {
                TEST_CHK(markers[r].kvs_markers[i].seqnum
                         == (fdb_seqnum_t)(n - r*5));
                sprintf(kv_name, "kv%d", i);
                TEST_CMP(markers[r].kvs_markers[i].kv_store_name, kv_name, 3);
            }
        }
        i = r = 1;
        sprintf(compact_filename, "compact_test_compact%d", i);
        status = fdb_compact_upto(dbfile, compact_filename,
                markers[i].marker);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // create a snapshot
        status = fdb_snapshot_open(db[r], &snapshot,
                markers[i].kvs_markers[r].seqnum);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // close snapshot
        fdb_kvs_close(snapshot);
    }

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "compact upto marker in file test %s", multi_kv ?
                                                           "multiple kv mode:"
                                                         : "single kv mode:");
    TEST_RESULT(bodybuf);
}